

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# JavascriptLibrary.cpp
# Opt level: O0

void __thiscall Js::JavascriptLibrary::InitializePrototypes(JavascriptLibrary *this)

{
  bool bVar1;
  ScriptContext **ppSVar2;
  Recycler *pRVar3;
  RecyclableObject *pRVar4;
  Type *this_00;
  TypePath *ptr;
  RecyclableObject **ppRVar5;
  DeferredTypeHandler<&Js::JavascriptLibrary::InitializeObjectPrototype,_Js::DefaultDeferredTypeFilter,_true,_(unsigned_short)0,_(unsigned_short)0>
  *typeHandler;
  DynamicType *pDVar6;
  ObjectPrototypeObject *pOVar7;
  ObjectPrototypeObject **ppOVar8;
  DynamicType *pDVar9;
  DeferredTypeHandler<&Js::JavascriptLibrary::InitializeArrayBufferPrototype,_Js::DefaultDeferredTypeFilter,_true,_(unsigned_short)0,_(unsigned_short)0>
  *typeHandler_00;
  DynamicObject *pDVar10;
  ScriptContext *pSVar11;
  ScriptConfiguration *pSVar12;
  DeferredTypeHandler<&Js::JavascriptLibrary::InitializeSharedArrayBufferPrototype,_Js::DefaultDeferredTypeFilter,_true,_(unsigned_short)0,_(unsigned_short)0>
  *typeHandler_01;
  DeferredTypeHandler<&Js::JavascriptLibrary::InitializeDataViewPrototype,_Js::DefaultDeferredTypeFilter,_true,_(unsigned_short)0,_(unsigned_short)0>
  *typeHandler_02;
  DeferredTypeHandler<&Js::JavascriptLibrary::InitializeTypedArrayPrototype,_Js::DefaultDeferredTypeFilter,_true,_(unsigned_short)0,_(unsigned_short)0>
  *typeHandler_03;
  DynamicObject **ppDVar13;
  DeferredTypeHandler<&Js::JavascriptLibrary::InitializeInt8ArrayPrototype,_Js::DefaultDeferredTypeFilter,_true,_(unsigned_short)0,_(unsigned_short)0>
  *typeHandler_04;
  DeferredTypeHandler<&Js::JavascriptLibrary::InitializeUint8ArrayPrototype,_Js::DefaultDeferredTypeFilter,_true,_(unsigned_short)0,_(unsigned_short)0>
  *typeHandler_05;
  DeferredTypeHandler<&Js::JavascriptLibrary::InitializeUint8ClampedArrayPrototype,_Js::DefaultDeferredTypeFilter,_true,_(unsigned_short)0,_(unsigned_short)0>
  *typeHandler_06;
  DeferredTypeHandler<&Js::JavascriptLibrary::InitializeInt16ArrayPrototype,_Js::DefaultDeferredTypeFilter,_true,_(unsigned_short)0,_(unsigned_short)0>
  *typeHandler_07;
  DeferredTypeHandler<&Js::JavascriptLibrary::InitializeUint16ArrayPrototype,_Js::DefaultDeferredTypeFilter,_true,_(unsigned_short)0,_(unsigned_short)0>
  *typeHandler_08;
  DeferredTypeHandler<&Js::JavascriptLibrary::InitializeInt32ArrayPrototype,_Js::DefaultDeferredTypeFilter,_true,_(unsigned_short)0,_(unsigned_short)0>
  *typeHandler_09;
  DeferredTypeHandler<&Js::JavascriptLibrary::InitializeUint32ArrayPrototype,_Js::DefaultDeferredTypeFilter,_true,_(unsigned_short)0,_(unsigned_short)0>
  *typeHandler_10;
  DeferredTypeHandler<&Js::JavascriptLibrary::InitializeFloat32ArrayPrototype,_Js::DefaultDeferredTypeFilter,_true,_(unsigned_short)0,_(unsigned_short)0>
  *typeHandler_11;
  DeferredTypeHandler<&Js::JavascriptLibrary::InitializeFloat64ArrayPrototype,_Js::DefaultDeferredTypeFilter,_true,_(unsigned_short)0,_(unsigned_short)0>
  *typeHandler_12;
  DeferredTypeHandler<&Js::JavascriptLibrary::InitializeInt64ArrayPrototype,_Js::DefaultDeferredTypeFilter,_true,_(unsigned_short)0,_(unsigned_short)0>
  *typeHandler_13;
  DeferredTypeHandler<&Js::JavascriptLibrary::InitializeUint64ArrayPrototype,_Js::DefaultDeferredTypeFilter,_true,_(unsigned_short)0,_(unsigned_short)0>
  *typeHandler_14;
  DeferredTypeHandler<&Js::JavascriptLibrary::InitializeBoolArrayPrototype,_Js::DefaultDeferredTypeFilter,_true,_(unsigned_short)0,_(unsigned_short)0>
  *typeHandler_15;
  DeferredTypeHandler<&Js::JavascriptLibrary::InitializeCharArrayPrototype,_Js::DefaultDeferredTypeFilter,_true,_(unsigned_short)0,_(unsigned_short)0>
  *typeHandler_16;
  DeferredTypeHandler<&Js::JavascriptLibrary::InitializeArrayPrototype,_Js::DefaultDeferredTypeFilter,_true,_(unsigned_short)0,_(unsigned_short)0>
  *typeHandler_17;
  JavascriptArray *ptr_00;
  DeferredTypeHandler<&Js::JavascriptLibrary::InitializeBooleanPrototype,_Js::DefaultDeferredTypeFilter,_true,_(unsigned_short)0,_(unsigned_short)0>
  *typeHandler_18;
  JavascriptBooleanObject *this_01;
  DeferredTypeHandler<&Js::JavascriptLibrary::InitializeNumberPrototype,_Js::DefaultDeferredTypeFilter,_true,_(unsigned_short)0,_(unsigned_short)0>
  *typeHandler_19;
  JavascriptNumberObject *this_02;
  Var value;
  DeferredTypeHandler<&Js::JavascriptLibrary::InitializeBigIntPrototype,_Js::DefaultDeferredTypeFilter,_true,_(unsigned_short)0,_(unsigned_short)0>
  *typeHandler_20;
  JavascriptBigIntObject *this_03;
  DeferredTypeHandler<&Js::JavascriptLibrary::InitializeStringPrototype,_Js::DefaultDeferredTypeFilter,_true,_(unsigned_short)0,_(unsigned_short)0>
  *typeHandler_21;
  JavascriptStringObject *this_04;
  DeferredTypeHandler<&Js::JavascriptLibrary::InitializeRegexPrototype,_Js::DefaultDeferredTypeFilter,_true,_(unsigned_short)0,_(unsigned_short)0>
  *typeHandler_22;
  DeferredTypeHandler<&Js::JavascriptLibrary::InitializeDatePrototype,_Js::DefaultDeferredTypeFilter,_true,_(unsigned_short)0,_(unsigned_short)0>
  *pDVar14;
  JavascriptDate *this_05;
  DeferredTypeHandler<&Js::JavascriptLibrary::InitializeErrorPrototype,_Js::DefaultDeferredTypeFilter,_true,_(unsigned_short)0,_(unsigned_short)0>
  *pDVar15;
  JavascriptError *pJVar16;
  DeferredTypeHandler<&Js::JavascriptLibrary::InitializeEvalErrorPrototype,_Js::DefaultDeferredTypeFilter,_true,_(unsigned_short)0,_(unsigned_short)0>
  *pDVar17;
  DeferredTypeHandler<&Js::JavascriptLibrary::InitializeRangeErrorPrototype,_Js::DefaultDeferredTypeFilter,_true,_(unsigned_short)0,_(unsigned_short)0>
  *pDVar18;
  DeferredTypeHandler<&Js::JavascriptLibrary::InitializeReferenceErrorPrototype,_Js::DefaultDeferredTypeFilter,_true,_(unsigned_short)0,_(unsigned_short)0>
  *pDVar19;
  DeferredTypeHandler<&Js::JavascriptLibrary::InitializeSyntaxErrorPrototype,_Js::DefaultDeferredTypeFilter,_true,_(unsigned_short)0,_(unsigned_short)0>
  *pDVar20;
  DeferredTypeHandler<&Js::JavascriptLibrary::InitializeTypeErrorPrototype,_Js::DefaultDeferredTypeFilter,_true,_(unsigned_short)0,_(unsigned_short)0>
  *pDVar21;
  DeferredTypeHandler<&Js::JavascriptLibrary::InitializeURIErrorPrototype,_Js::DefaultDeferredTypeFilter,_true,_(unsigned_short)0,_(unsigned_short)0>
  *pDVar22;
  DeferredTypeHandler<&Js::JavascriptLibrary::InitializeAggregateErrorPrototype,_Js::DefaultDeferredTypeFilter,_true,_(unsigned_short)0,_(unsigned_short)0>
  *pDVar23;
  DeferredTypeHandler<&Js::JavascriptLibrary::InitializeWebAssemblyCompileErrorPrototype,_Js::DefaultDeferredTypeFilter,_true,_(unsigned_short)0,_(unsigned_short)0>
  *pDVar24;
  DeferredTypeHandler<&Js::JavascriptLibrary::InitializeWebAssemblyRuntimeErrorPrototype,_Js::DefaultDeferredTypeFilter,_true,_(unsigned_short)0,_(unsigned_short)0>
  *pDVar25;
  DeferredTypeHandler<&Js::JavascriptLibrary::InitializeWebAssemblyLinkErrorPrototype,_Js::DefaultDeferredTypeFilter,_true,_(unsigned_short)0,_(unsigned_short)0>
  *pDVar26;
  DeferredTypeHandler<&Js::JavascriptLibrary::InitializeFunctionPrototype,_Js::DefaultDeferredTypeFilter,_true,_(unsigned_short)0,_(unsigned_short)0>
  *typeHandler_23;
  JavascriptFunction *this_06;
  DeferredTypeHandler<&Js::JavascriptLibrary::InitializeSymbolPrototype,_Js::DefaultDeferredTypeFilter,_true,_(unsigned_short)0,_(unsigned_short)0>
  *typeHandler_24;
  DeferredTypeHandler<&Js::JavascriptLibrary::InitializeMapPrototype,_Js::DefaultDeferredTypeFilter,_true,_(unsigned_short)0,_(unsigned_short)0>
  *typeHandler_25;
  DeferredTypeHandler<&Js::JavascriptLibrary::InitializeSetPrototype,_Js::DefaultDeferredTypeFilter,_true,_(unsigned_short)0,_(unsigned_short)0>
  *typeHandler_26;
  DeferredTypeHandler<&Js::JavascriptLibrary::InitializeWeakMapPrototype,_Js::DefaultDeferredTypeFilter,_true,_(unsigned_short)0,_(unsigned_short)0>
  *typeHandler_27;
  DeferredTypeHandler<&Js::JavascriptLibrary::InitializeWeakSetPrototype,_Js::DefaultDeferredTypeFilter,_true,_(unsigned_short)0,_(unsigned_short)0>
  *typeHandler_28;
  DeferredTypeHandler<&Js::JavascriptLibrary::InitializeAsyncIteratorPrototype,_Js::DefaultDeferredTypeFilter,_true,_(unsigned_short)0,_(unsigned_short)0>
  *typeHandler_29;
  DeferredTypeHandler<&Js::JavascriptLibrary::InitializeIteratorPrototype,_Js::DefaultDeferredTypeFilter,_true,_(unsigned_short)0,_(unsigned_short)0>
  *typeHandler_30;
  DeferredTypeHandler<&Js::JavascriptLibrary::InitializeArrayIteratorPrototype,_Js::DefaultDeferredTypeFilter,_true,_(unsigned_short)0,_(unsigned_short)0>
  *typeHandler_31;
  DeferredTypeHandler<&Js::JavascriptLibrary::InitializeMapIteratorPrototype,_Js::DefaultDeferredTypeFilter,_true,_(unsigned_short)0,_(unsigned_short)0>
  *typeHandler_32;
  DeferredTypeHandler<&Js::JavascriptLibrary::InitializeSetIteratorPrototype,_Js::DefaultDeferredTypeFilter,_true,_(unsigned_short)0,_(unsigned_short)0>
  *typeHandler_33;
  DeferredTypeHandler<&Js::JavascriptLibrary::InitializeStringIteratorPrototype,_Js::DefaultDeferredTypeFilter,_true,_(unsigned_short)0,_(unsigned_short)0>
  *typeHandler_34;
  DeferredTypeHandler<&Js::JavascriptLibrary::InitializeWebAssemblyMemoryPrototype,_Js::DefaultDeferredTypeFilter,_true,_(unsigned_short)0,_(unsigned_short)0>
  *typeHandler_35;
  DeferredTypeHandler<&Js::JavascriptLibrary::InitializeWebAssemblyModulePrototype,_Js::DefaultDeferredTypeFilter,_true,_(unsigned_short)0,_(unsigned_short)0>
  *typeHandler_36;
  DeferredTypeHandler<&Js::JavascriptLibrary::InitializeWebAssemblyInstancePrototype,_Js::DefaultDeferredTypeFilter,_true,_(unsigned_short)0,_(unsigned_short)0>
  *typeHandler_37;
  DeferredTypeHandler<&Js::JavascriptLibrary::InitializeWebAssemblyTablePrototype,_Js::DefaultDeferredTypeFilter,_true,_(unsigned_short)0,_(unsigned_short)0>
  *typeHandler_38;
  DeferredTypeHandler<&Js::JavascriptLibrary::InitializePromisePrototype,_Js::DefaultDeferredTypeFilter,_true,_(unsigned_short)0,_(unsigned_short)0>
  *typeHandler_39;
  DeferredTypeHandler<&Js::JavascriptLibrary::InitializeGeneratorFunctionPrototype,_Js::DefaultDeferredTypeFilter,_true,_(unsigned_short)0,_(unsigned_short)0>
  *typeHandler_40;
  DeferredTypeHandler<&Js::JavascriptLibrary::InitializeGeneratorPrototype,_Js::DefaultDeferredTypeFilter,_true,_(unsigned_short)0,_(unsigned_short)0>
  *typeHandler_41;
  DeferredTypeHandler<&Js::JavascriptLibrary::InitializeAsyncFunctionPrototype,_Js::DefaultDeferredTypeFilter,_true,_(unsigned_short)0,_(unsigned_short)0>
  *typeHandler_42;
  DeferredTypeHandler<&Js::JavascriptLibrary::InitializeAsyncGeneratorFunctionPrototype,_Js::DefaultDeferredTypeFilter,_true,_(unsigned_short)0,_(unsigned_short)0>
  *typeHandler_43;
  DeferredTypeHandler<&Js::JavascriptLibrary::InitializeAsyncGeneratorPrototype,_Js::DefaultDeferredTypeFilter,_true,_(unsigned_short)0,_(unsigned_short)0>
  *typeHandler_44;
  DeferredTypeHandler<&Js::JavascriptLibrary::InitializeAsyncFromSyncIteratorPrototype,_Js::DefaultDeferredTypeFilter,_true,_(unsigned_short)0,_(unsigned_short)0>
  *typeHandler_45;
  Type *pTVar27;
  Type *pTVar28;
  Type *this_07;
  nullptr_t local_460;
  nullptr_t local_458;
  nullptr_t local_450;
  nullptr_t local_448;
  nullptr_t local_440;
  nullptr_t local_438;
  code *local_430;
  undefined8 local_428;
  TrackAllocData local_420;
  code *local_3f8;
  undefined8 local_3f0;
  TrackAllocData local_3e8;
  code *local_3c0;
  undefined8 local_3b8;
  TrackAllocData local_3b0;
  code *local_388;
  undefined8 local_380;
  TrackAllocData local_378;
  code *local_350;
  undefined8 local_348;
  TrackAllocData local_340;
  code *local_318;
  undefined8 local_310;
  TrackAllocData local_308;
  code *local_2e0;
  undefined8 local_2d8;
  TrackAllocData local_2d0;
  code *local_2a8;
  undefined8 local_2a0;
  TrackAllocData local_298;
  code *local_270;
  undefined8 local_268;
  TrackAllocData local_260;
  code *local_238;
  undefined8 local_230;
  TrackAllocData local_228;
  code *local_200;
  undefined8 local_1f8;
  TrackAllocData local_1f0;
  code *local_1c8;
  undefined8 local_1c0;
  TrackAllocData local_1b8;
  code *local_190;
  undefined8 local_188;
  TrackAllocData local_180;
  double local_158;
  double initDateValue;
  undefined8 local_148;
  TrackAllocData local_140;
  code *local_118;
  undefined8 local_110;
  TrackAllocData local_108;
  nullptr_t local_e0;
  code *local_d8;
  undefined8 local_d0;
  TrackAllocData local_c8;
  code *local_a0;
  undefined8 local_98;
  TrackAllocData local_90;
  nullptr_t local_68;
  code *local_60;
  undefined8 local_58;
  TrackAllocData local_50;
  Type *local_28;
  Type *tempType;
  DynamicType *tempDynamicType;
  Recycler *recycler;
  JavascriptLibrary *this_local;
  
  recycler = (Recycler *)this;
  tempDynamicType = (DynamicType *)GetRecycler(this);
  tempType = (Type *)0x0;
  ppSVar2 = Memory::WriteBarrierPtr::operator_cast_to_ScriptContext__
                      ((WriteBarrierPtr *)&(this->super_JavascriptLibraryBase).scriptContext);
  local_28 = &StaticType::New(*ppSVar2,TypeIds_Null,(RecyclableObject *)0x0,(JavascriptMethod)0x0)->
              super_Type;
  pDVar9 = tempDynamicType;
  Memory::TrackAllocData::CreateTrackAllocData
            (&local_50,(type_info *)&RecyclableObject::typeinfo,0,0xffffffffffffffff,
             "/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Runtime/Library/JavascriptLibrary.cpp"
             ,0xad);
  pRVar3 = Memory::Recycler::TrackAllocInfo((Recycler *)pDVar9,&local_50);
  local_60 = Memory::Recycler::AllocInlined;
  local_58 = 0;
  pRVar4 = (RecyclableObject *)new<Memory::Recycler>(0x10,pRVar3,0x43c4b0);
  RecyclableObject::RecyclableObject(pRVar4,local_28);
  Memory::WriteBarrierPtr<Js::RecyclableObject>::operator=
            (&(this->super_JavascriptLibraryBase).nullValue,pRVar4);
  pRVar4 = Memory::WriteBarrierPtr<Js::RecyclableObject>::operator->
                     (&(this->super_JavascriptLibraryBase).nullValue);
  this_00 = RecyclableObject::GetType(pRVar4);
  Js::Type::SetHasSpecialPrototype(this_00,true);
  ptr = TypePath::New((Recycler *)tempDynamicType,0x10);
  Memory::WriteBarrierPtr<Js::TypePath>::operator=(&this->rootPath,ptr);
  pDVar9 = tempDynamicType;
  ppSVar2 = Memory::WriteBarrierPtr::operator_cast_to_ScriptContext__
                      ((WriteBarrierPtr *)&(this->super_JavascriptLibraryBase).scriptContext);
  pSVar11 = *ppSVar2;
  ppRVar5 = Memory::WriteBarrierPtr::operator_cast_to_RecyclableObject__
                      ((WriteBarrierPtr *)&(this->super_JavascriptLibraryBase).nullValue);
  pRVar4 = *ppRVar5;
  typeHandler = DeferredTypeHandler<&Js::JavascriptLibrary::InitializeObjectPrototype,_Js::DefaultDeferredTypeFilter,_true,_(unsigned_short)0,_(unsigned_short)0>
                ::GetDefaultInstance();
  pDVar6 = DynamicType::New(pSVar11,TypeIds_Object,pRVar4,(JavascriptMethod)0x0,
                            (DynamicTypeHandler *)typeHandler,false,false);
  pOVar7 = ObjectPrototypeObject::New((Recycler *)pDVar9,pDVar6);
  Memory::WriteBarrierPtr<Js::ObjectPrototypeObject>::operator=
            (&(this->super_JavascriptLibraryBase).objectPrototype,pOVar7);
  ppSVar2 = Memory::WriteBarrierPtr::operator_cast_to_ScriptContext__
                      ((WriteBarrierPtr *)&(this->super_JavascriptLibraryBase).scriptContext);
  pSVar11 = *ppSVar2;
  ppOVar8 = Memory::WriteBarrierPtr::operator_cast_to_ObjectPrototypeObject__
                      ((WriteBarrierPtr *)&(this->super_JavascriptLibraryBase).objectPrototype);
  pDVar9 = DynamicType::New(pSVar11,TypeIds_Object,(RecyclableObject *)*ppOVar8,
                            (JavascriptMethod)0x0,(DynamicTypeHandler *)SharedPrototypeTypeHandler,
                            true,true);
  Memory::WriteBarrierPtr<Js::DynamicType>::operator=(&this->constructorPrototypeObjectType,pDVar9);
  pDVar9 = Memory::WriteBarrierPtr<Js::DynamicType>::operator->
                     (&this->constructorPrototypeObjectType);
  DynamicType::SetHasNoEnumerableProperties(pDVar9,true);
  pDVar9 = tempDynamicType;
  ppSVar2 = Memory::WriteBarrierPtr::operator_cast_to_ScriptContext__
                      ((WriteBarrierPtr *)&(this->super_JavascriptLibraryBase).scriptContext);
  pSVar11 = *ppSVar2;
  ppOVar8 = Memory::WriteBarrierPtr::operator_cast_to_ObjectPrototypeObject__
                      ((WriteBarrierPtr *)&(this->super_JavascriptLibraryBase).objectPrototype);
  pOVar7 = *ppOVar8;
  typeHandler_00 =
       DeferredTypeHandler<&Js::JavascriptLibrary::InitializeArrayBufferPrototype,_Js::DefaultDeferredTypeFilter,_true,_(unsigned_short)0,_(unsigned_short)0>
       ::GetDefaultInstance();
  pDVar6 = DynamicType::New(pSVar11,TypeIds_Object,(RecyclableObject *)pOVar7,(JavascriptMethod)0x0,
                            (DynamicTypeHandler *)typeHandler_00,false,false);
  pDVar10 = DynamicObject::New((Recycler *)pDVar9,pDVar6);
  Memory::WriteBarrierPtr<Js::DynamicObject>::operator=
            (&(this->super_JavascriptLibraryBase).arrayBufferPrototype,pDVar10);
  pSVar11 = Memory::WriteBarrierPtr<Js::ScriptContext>::operator->
                      (&(this->super_JavascriptLibraryBase).scriptContext);
  pSVar12 = ScriptContext::GetConfig(pSVar11);
  bVar1 = ScriptConfiguration::IsESSharedArrayBufferEnabled(pSVar12);
  pDVar9 = tempDynamicType;
  if (bVar1) {
    ppSVar2 = Memory::WriteBarrierPtr::operator_cast_to_ScriptContext__
                        ((WriteBarrierPtr *)&(this->super_JavascriptLibraryBase).scriptContext);
    pSVar11 = *ppSVar2;
    ppOVar8 = Memory::WriteBarrierPtr::operator_cast_to_ObjectPrototypeObject__
                        ((WriteBarrierPtr *)&(this->super_JavascriptLibraryBase).objectPrototype);
    pOVar7 = *ppOVar8;
    typeHandler_01 =
         DeferredTypeHandler<&Js::JavascriptLibrary::InitializeSharedArrayBufferPrototype,_Js::DefaultDeferredTypeFilter,_true,_(unsigned_short)0,_(unsigned_short)0>
         ::GetDefaultInstance();
    pDVar6 = DynamicType::New(pSVar11,TypeIds_Object,(RecyclableObject *)pOVar7,
                              (JavascriptMethod)0x0,(DynamicTypeHandler *)typeHandler_01,false,false
                             );
    pDVar10 = DynamicObject::New((Recycler *)pDVar9,pDVar6);
    Memory::WriteBarrierPtr<Js::DynamicObject>::operator=(&this->sharedArrayBufferPrototype,pDVar10)
    ;
  }
  else {
    local_68 = (nullptr_t)0x0;
    Memory::WriteBarrierPtr<Js::DynamicObject>::operator=
              (&this->sharedArrayBufferPrototype,&local_68);
  }
  pDVar9 = tempDynamicType;
  pTVar27 = &(this->super_JavascriptLibraryBase).scriptContext;
  ppSVar2 = Memory::WriteBarrierPtr::operator_cast_to_ScriptContext__((WriteBarrierPtr *)pTVar27);
  pSVar11 = *ppSVar2;
  pTVar28 = &(this->super_JavascriptLibraryBase).objectPrototype;
  ppOVar8 = Memory::WriteBarrierPtr::operator_cast_to_ObjectPrototypeObject__
                      ((WriteBarrierPtr *)pTVar28);
  pOVar7 = *ppOVar8;
  typeHandler_02 =
       DeferredTypeHandler<&Js::JavascriptLibrary::InitializeDataViewPrototype,_Js::DefaultDeferredTypeFilter,_true,_(unsigned_short)0,_(unsigned_short)0>
       ::GetDefaultInstance();
  pDVar6 = DynamicType::New(pSVar11,TypeIds_Object,(RecyclableObject *)pOVar7,(JavascriptMethod)0x0,
                            (DynamicTypeHandler *)typeHandler_02,false,false);
  pDVar10 = DynamicObject::New((Recycler *)pDVar9,pDVar6);
  Memory::WriteBarrierPtr<Js::DynamicObject>::operator=
            (&(this->super_JavascriptLibraryBase).dataViewPrototype,pDVar10);
  pDVar9 = tempDynamicType;
  ppSVar2 = Memory::WriteBarrierPtr::operator_cast_to_ScriptContext__((WriteBarrierPtr *)pTVar27);
  pSVar11 = *ppSVar2;
  ppOVar8 = Memory::WriteBarrierPtr::operator_cast_to_ObjectPrototypeObject__
                      ((WriteBarrierPtr *)pTVar28);
  pOVar7 = *ppOVar8;
  typeHandler_03 =
       DeferredTypeHandler<&Js::JavascriptLibrary::InitializeTypedArrayPrototype,_Js::DefaultDeferredTypeFilter,_true,_(unsigned_short)0,_(unsigned_short)0>
       ::GetDefaultInstance();
  pDVar6 = DynamicType::New(pSVar11,TypeIds_Object,(RecyclableObject *)pOVar7,(JavascriptMethod)0x0,
                            (DynamicTypeHandler *)typeHandler_03,false,false);
  pDVar10 = DynamicObject::New((Recycler *)pDVar9,pDVar6);
  this_07 = &(this->super_JavascriptLibraryBase).typedArrayPrototype;
  Memory::WriteBarrierPtr<Js::DynamicObject>::operator=(this_07,pDVar10);
  pDVar9 = tempDynamicType;
  ppSVar2 = Memory::WriteBarrierPtr::operator_cast_to_ScriptContext__((WriteBarrierPtr *)pTVar27);
  pSVar11 = *ppSVar2;
  ppDVar13 = Memory::WriteBarrierPtr::operator_cast_to_DynamicObject__((WriteBarrierPtr *)this_07);
  pDVar10 = *ppDVar13;
  typeHandler_04 =
       DeferredTypeHandler<&Js::JavascriptLibrary::InitializeInt8ArrayPrototype,_Js::DefaultDeferredTypeFilter,_true,_(unsigned_short)0,_(unsigned_short)0>
       ::GetDefaultInstance();
  pDVar6 = DynamicType::New(pSVar11,TypeIds_Object,&pDVar10->super_RecyclableObject,
                            (JavascriptMethod)0x0,(DynamicTypeHandler *)typeHandler_04,false,false);
  pDVar10 = DynamicObject::New((Recycler *)pDVar9,pDVar6);
  Memory::WriteBarrierPtr<Js::DynamicObject>::operator=
            (&(this->super_JavascriptLibraryBase).Int8ArrayPrototype,pDVar10);
  pDVar9 = tempDynamicType;
  ppSVar2 = Memory::WriteBarrierPtr::operator_cast_to_ScriptContext__((WriteBarrierPtr *)pTVar27);
  pSVar11 = *ppSVar2;
  ppDVar13 = Memory::WriteBarrierPtr::operator_cast_to_DynamicObject__((WriteBarrierPtr *)this_07);
  pDVar10 = *ppDVar13;
  typeHandler_05 =
       DeferredTypeHandler<&Js::JavascriptLibrary::InitializeUint8ArrayPrototype,_Js::DefaultDeferredTypeFilter,_true,_(unsigned_short)0,_(unsigned_short)0>
       ::GetDefaultInstance();
  pDVar6 = DynamicType::New(pSVar11,TypeIds_Object,&pDVar10->super_RecyclableObject,
                            (JavascriptMethod)0x0,(DynamicTypeHandler *)typeHandler_05,false,false);
  pDVar10 = DynamicObject::New((Recycler *)pDVar9,pDVar6);
  Memory::WriteBarrierPtr<Js::DynamicObject>::operator=
            (&(this->super_JavascriptLibraryBase).Uint8ArrayPrototype,pDVar10);
  pDVar9 = tempDynamicType;
  ppSVar2 = Memory::WriteBarrierPtr::operator_cast_to_ScriptContext__((WriteBarrierPtr *)pTVar27);
  pSVar11 = *ppSVar2;
  ppDVar13 = Memory::WriteBarrierPtr::operator_cast_to_DynamicObject__((WriteBarrierPtr *)this_07);
  pDVar10 = *ppDVar13;
  typeHandler_06 =
       DeferredTypeHandler<&Js::JavascriptLibrary::InitializeUint8ClampedArrayPrototype,_Js::DefaultDeferredTypeFilter,_true,_(unsigned_short)0,_(unsigned_short)0>
       ::GetDefaultInstance();
  pDVar6 = DynamicType::New(pSVar11,TypeIds_Object,&pDVar10->super_RecyclableObject,
                            (JavascriptMethod)0x0,(DynamicTypeHandler *)typeHandler_06,false,false);
  pDVar10 = DynamicObject::New((Recycler *)pDVar9,pDVar6);
  Memory::WriteBarrierPtr<Js::DynamicObject>::operator=
            (&(this->super_JavascriptLibraryBase).Uint8ClampedArrayPrototype,pDVar10);
  pDVar9 = tempDynamicType;
  ppSVar2 = Memory::WriteBarrierPtr::operator_cast_to_ScriptContext__((WriteBarrierPtr *)pTVar27);
  pSVar11 = *ppSVar2;
  ppDVar13 = Memory::WriteBarrierPtr::operator_cast_to_DynamicObject__((WriteBarrierPtr *)this_07);
  pDVar10 = *ppDVar13;
  typeHandler_07 =
       DeferredTypeHandler<&Js::JavascriptLibrary::InitializeInt16ArrayPrototype,_Js::DefaultDeferredTypeFilter,_true,_(unsigned_short)0,_(unsigned_short)0>
       ::GetDefaultInstance();
  pDVar6 = DynamicType::New(pSVar11,TypeIds_Object,&pDVar10->super_RecyclableObject,
                            (JavascriptMethod)0x0,(DynamicTypeHandler *)typeHandler_07,false,false);
  pDVar10 = DynamicObject::New((Recycler *)pDVar9,pDVar6);
  Memory::WriteBarrierPtr<Js::DynamicObject>::operator=
            (&(this->super_JavascriptLibraryBase).Int16ArrayPrototype,pDVar10);
  pDVar9 = tempDynamicType;
  ppSVar2 = Memory::WriteBarrierPtr::operator_cast_to_ScriptContext__((WriteBarrierPtr *)pTVar27);
  pSVar11 = *ppSVar2;
  ppDVar13 = Memory::WriteBarrierPtr::operator_cast_to_DynamicObject__((WriteBarrierPtr *)this_07);
  pDVar10 = *ppDVar13;
  typeHandler_08 =
       DeferredTypeHandler<&Js::JavascriptLibrary::InitializeUint16ArrayPrototype,_Js::DefaultDeferredTypeFilter,_true,_(unsigned_short)0,_(unsigned_short)0>
       ::GetDefaultInstance();
  pDVar6 = DynamicType::New(pSVar11,TypeIds_Object,&pDVar10->super_RecyclableObject,
                            (JavascriptMethod)0x0,(DynamicTypeHandler *)typeHandler_08,false,false);
  pDVar10 = DynamicObject::New((Recycler *)pDVar9,pDVar6);
  Memory::WriteBarrierPtr<Js::DynamicObject>::operator=
            (&(this->super_JavascriptLibraryBase).Uint16ArrayPrototype,pDVar10);
  pDVar9 = tempDynamicType;
  ppSVar2 = Memory::WriteBarrierPtr::operator_cast_to_ScriptContext__((WriteBarrierPtr *)pTVar27);
  pSVar11 = *ppSVar2;
  ppDVar13 = Memory::WriteBarrierPtr::operator_cast_to_DynamicObject__((WriteBarrierPtr *)this_07);
  pDVar10 = *ppDVar13;
  typeHandler_09 =
       DeferredTypeHandler<&Js::JavascriptLibrary::InitializeInt32ArrayPrototype,_Js::DefaultDeferredTypeFilter,_true,_(unsigned_short)0,_(unsigned_short)0>
       ::GetDefaultInstance();
  pDVar6 = DynamicType::New(pSVar11,TypeIds_Object,&pDVar10->super_RecyclableObject,
                            (JavascriptMethod)0x0,(DynamicTypeHandler *)typeHandler_09,false,false);
  pDVar10 = DynamicObject::New((Recycler *)pDVar9,pDVar6);
  Memory::WriteBarrierPtr<Js::DynamicObject>::operator=
            (&(this->super_JavascriptLibraryBase).Int32ArrayPrototype,pDVar10);
  pDVar9 = tempDynamicType;
  ppSVar2 = Memory::WriteBarrierPtr::operator_cast_to_ScriptContext__((WriteBarrierPtr *)pTVar27);
  pSVar11 = *ppSVar2;
  ppDVar13 = Memory::WriteBarrierPtr::operator_cast_to_DynamicObject__((WriteBarrierPtr *)this_07);
  pDVar10 = *ppDVar13;
  typeHandler_10 =
       DeferredTypeHandler<&Js::JavascriptLibrary::InitializeUint32ArrayPrototype,_Js::DefaultDeferredTypeFilter,_true,_(unsigned_short)0,_(unsigned_short)0>
       ::GetDefaultInstance();
  pDVar6 = DynamicType::New(pSVar11,TypeIds_Object,&pDVar10->super_RecyclableObject,
                            (JavascriptMethod)0x0,(DynamicTypeHandler *)typeHandler_10,false,false);
  pDVar10 = DynamicObject::New((Recycler *)pDVar9,pDVar6);
  Memory::WriteBarrierPtr<Js::DynamicObject>::operator=
            (&(this->super_JavascriptLibraryBase).Uint32ArrayPrototype,pDVar10);
  pDVar9 = tempDynamicType;
  ppSVar2 = Memory::WriteBarrierPtr::operator_cast_to_ScriptContext__((WriteBarrierPtr *)pTVar27);
  pSVar11 = *ppSVar2;
  ppDVar13 = Memory::WriteBarrierPtr::operator_cast_to_DynamicObject__((WriteBarrierPtr *)this_07);
  pDVar10 = *ppDVar13;
  typeHandler_11 =
       DeferredTypeHandler<&Js::JavascriptLibrary::InitializeFloat32ArrayPrototype,_Js::DefaultDeferredTypeFilter,_true,_(unsigned_short)0,_(unsigned_short)0>
       ::GetDefaultInstance();
  pDVar6 = DynamicType::New(pSVar11,TypeIds_Object,&pDVar10->super_RecyclableObject,
                            (JavascriptMethod)0x0,(DynamicTypeHandler *)typeHandler_11,false,false);
  pDVar10 = DynamicObject::New((Recycler *)pDVar9,pDVar6);
  Memory::WriteBarrierPtr<Js::DynamicObject>::operator=
            (&(this->super_JavascriptLibraryBase).Float32ArrayPrototype,pDVar10);
  pDVar9 = tempDynamicType;
  ppSVar2 = Memory::WriteBarrierPtr::operator_cast_to_ScriptContext__((WriteBarrierPtr *)pTVar27);
  pSVar11 = *ppSVar2;
  ppDVar13 = Memory::WriteBarrierPtr::operator_cast_to_DynamicObject__((WriteBarrierPtr *)this_07);
  pDVar10 = *ppDVar13;
  typeHandler_12 =
       DeferredTypeHandler<&Js::JavascriptLibrary::InitializeFloat64ArrayPrototype,_Js::DefaultDeferredTypeFilter,_true,_(unsigned_short)0,_(unsigned_short)0>
       ::GetDefaultInstance();
  pDVar6 = DynamicType::New(pSVar11,TypeIds_Object,&pDVar10->super_RecyclableObject,
                            (JavascriptMethod)0x0,(DynamicTypeHandler *)typeHandler_12,false,false);
  pDVar10 = DynamicObject::New((Recycler *)pDVar9,pDVar6);
  Memory::WriteBarrierPtr<Js::DynamicObject>::operator=
            (&(this->super_JavascriptLibraryBase).Float64ArrayPrototype,pDVar10);
  pDVar9 = tempDynamicType;
  ppSVar2 = Memory::WriteBarrierPtr::operator_cast_to_ScriptContext__((WriteBarrierPtr *)pTVar27);
  pSVar11 = *ppSVar2;
  ppDVar13 = Memory::WriteBarrierPtr::operator_cast_to_DynamicObject__((WriteBarrierPtr *)this_07);
  pDVar10 = *ppDVar13;
  typeHandler_13 =
       DeferredTypeHandler<&Js::JavascriptLibrary::InitializeInt64ArrayPrototype,_Js::DefaultDeferredTypeFilter,_true,_(unsigned_short)0,_(unsigned_short)0>
       ::GetDefaultInstance();
  pDVar6 = DynamicType::New(pSVar11,TypeIds_Object,&pDVar10->super_RecyclableObject,
                            (JavascriptMethod)0x0,(DynamicTypeHandler *)typeHandler_13,false,false);
  pDVar10 = DynamicObject::New((Recycler *)pDVar9,pDVar6);
  Memory::WriteBarrierPtr<Js::DynamicObject>::operator=
            (&(this->super_JavascriptLibraryBase).Int64ArrayPrototype,pDVar10);
  pDVar9 = tempDynamicType;
  ppSVar2 = Memory::WriteBarrierPtr::operator_cast_to_ScriptContext__((WriteBarrierPtr *)pTVar27);
  pSVar11 = *ppSVar2;
  ppDVar13 = Memory::WriteBarrierPtr::operator_cast_to_DynamicObject__((WriteBarrierPtr *)this_07);
  pDVar10 = *ppDVar13;
  typeHandler_14 =
       DeferredTypeHandler<&Js::JavascriptLibrary::InitializeUint64ArrayPrototype,_Js::DefaultDeferredTypeFilter,_true,_(unsigned_short)0,_(unsigned_short)0>
       ::GetDefaultInstance();
  pDVar6 = DynamicType::New(pSVar11,TypeIds_Object,&pDVar10->super_RecyclableObject,
                            (JavascriptMethod)0x0,(DynamicTypeHandler *)typeHandler_14,false,false);
  pDVar10 = DynamicObject::New((Recycler *)pDVar9,pDVar6);
  Memory::WriteBarrierPtr<Js::DynamicObject>::operator=
            (&(this->super_JavascriptLibraryBase).Uint64ArrayPrototype,pDVar10);
  pDVar9 = tempDynamicType;
  ppSVar2 = Memory::WriteBarrierPtr::operator_cast_to_ScriptContext__((WriteBarrierPtr *)pTVar27);
  pSVar11 = *ppSVar2;
  ppDVar13 = Memory::WriteBarrierPtr::operator_cast_to_DynamicObject__((WriteBarrierPtr *)this_07);
  pDVar10 = *ppDVar13;
  typeHandler_15 =
       DeferredTypeHandler<&Js::JavascriptLibrary::InitializeBoolArrayPrototype,_Js::DefaultDeferredTypeFilter,_true,_(unsigned_short)0,_(unsigned_short)0>
       ::GetDefaultInstance();
  pDVar6 = DynamicType::New(pSVar11,TypeIds_Object,&pDVar10->super_RecyclableObject,
                            (JavascriptMethod)0x0,(DynamicTypeHandler *)typeHandler_15,false,false);
  pDVar10 = DynamicObject::New((Recycler *)pDVar9,pDVar6);
  Memory::WriteBarrierPtr<Js::DynamicObject>::operator=
            (&(this->super_JavascriptLibraryBase).BoolArrayPrototype,pDVar10);
  pDVar9 = tempDynamicType;
  ppSVar2 = Memory::WriteBarrierPtr::operator_cast_to_ScriptContext__((WriteBarrierPtr *)pTVar27);
  pSVar11 = *ppSVar2;
  ppDVar13 = Memory::WriteBarrierPtr::operator_cast_to_DynamicObject__((WriteBarrierPtr *)this_07);
  pDVar10 = *ppDVar13;
  typeHandler_16 =
       DeferredTypeHandler<&Js::JavascriptLibrary::InitializeCharArrayPrototype,_Js::DefaultDeferredTypeFilter,_true,_(unsigned_short)0,_(unsigned_short)0>
       ::GetDefaultInstance();
  pDVar6 = DynamicType::New(pSVar11,TypeIds_Object,&pDVar10->super_RecyclableObject,
                            (JavascriptMethod)0x0,(DynamicTypeHandler *)typeHandler_16,false,false);
  pDVar10 = DynamicObject::New((Recycler *)pDVar9,pDVar6);
  Memory::WriteBarrierPtr<Js::DynamicObject>::operator=
            (&(this->super_JavascriptLibraryBase).CharArrayPrototype,pDVar10);
  ppSVar2 = Memory::WriteBarrierPtr::operator_cast_to_ScriptContext__((WriteBarrierPtr *)pTVar27);
  pSVar11 = *ppSVar2;
  ppOVar8 = Memory::WriteBarrierPtr::operator_cast_to_ObjectPrototypeObject__
                      ((WriteBarrierPtr *)pTVar28);
  pOVar7 = *ppOVar8;
  typeHandler_17 =
       DeferredTypeHandler<&Js::JavascriptLibrary::InitializeArrayPrototype,_Js::DefaultDeferredTypeFilter,_true,_(unsigned_short)0,_(unsigned_short)0>
       ::GetDefaultInstance();
  pDVar9 = DynamicType::New(pSVar11,TypeIds_Array,(RecyclableObject *)pOVar7,(JavascriptMethod)0x0,
                            (DynamicTypeHandler *)typeHandler_17,false,false);
  ptr_00 = Js::JavascriptArray::New<void*,Js::JavascriptArray,0u>
                     (0,pDVar9,(Recycler *)tempDynamicType);
  Memory::WriteBarrierPtr<Js::DynamicObject>::operator=
            (&(this->super_JavascriptLibraryBase).arrayPrototype,(DynamicObject *)ptr_00);
  ppSVar2 = Memory::WriteBarrierPtr::operator_cast_to_ScriptContext__((WriteBarrierPtr *)pTVar27);
  pSVar11 = *ppSVar2;
  ppOVar8 = Memory::WriteBarrierPtr::operator_cast_to_ObjectPrototypeObject__
                      ((WriteBarrierPtr *)pTVar28);
  pOVar7 = *ppOVar8;
  typeHandler_18 =
       DeferredTypeHandler<&Js::JavascriptLibrary::InitializeBooleanPrototype,_Js::DefaultDeferredTypeFilter,_true,_(unsigned_short)0,_(unsigned_short)0>
       ::GetDefaultInstance();
  tempType = &DynamicType::New(pSVar11,TypeIds_BooleanObject,(RecyclableObject *)pOVar7,
                               (JavascriptMethod)0x0,(DynamicTypeHandler *)typeHandler_18,false,
                               false)->super_Type;
  pDVar9 = tempDynamicType;
  Memory::TrackAllocData::CreateTrackAllocData
            (&local_90,(type_info *)&JavascriptBooleanObject::typeinfo,0,0xffffffffffffffff,
             "/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Runtime/Library/JavascriptLibrary.cpp"
             ,0x10d);
  pRVar3 = Memory::Recycler::TrackAllocInfo((Recycler *)pDVar9,&local_90);
  local_a0 = Memory::Recycler::AllocInlined;
  local_98 = 0;
  this_01 = (JavascriptBooleanObject *)new<Memory::Recycler>(0x28,pRVar3,0x43c4b0);
  JavascriptBooleanObject::JavascriptBooleanObject
            (this_01,(JavascriptBoolean *)0x0,(DynamicType *)tempType);
  Memory::WriteBarrierPtr<Js::DynamicObject>::operator=
            (&(this->super_JavascriptLibraryBase).booleanPrototype,(DynamicObject *)this_01);
  ppSVar2 = Memory::WriteBarrierPtr::operator_cast_to_ScriptContext__((WriteBarrierPtr *)pTVar27);
  pSVar11 = *ppSVar2;
  ppOVar8 = Memory::WriteBarrierPtr::operator_cast_to_ObjectPrototypeObject__
                      ((WriteBarrierPtr *)pTVar28);
  pOVar7 = *ppOVar8;
  typeHandler_19 =
       DeferredTypeHandler<&Js::JavascriptLibrary::InitializeNumberPrototype,_Js::DefaultDeferredTypeFilter,_true,_(unsigned_short)0,_(unsigned_short)0>
       ::GetDefaultInstance();
  tempType = &DynamicType::New(pSVar11,TypeIds_NumberObject,(RecyclableObject *)pOVar7,
                               (JavascriptMethod)0x0,(DynamicTypeHandler *)typeHandler_19,false,
                               false)->super_Type;
  pDVar9 = tempDynamicType;
  Memory::TrackAllocData::CreateTrackAllocData
            (&local_c8,(type_info *)&JavascriptNumberObject::typeinfo,0,0xffffffffffffffff,
             "/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Runtime/Library/JavascriptLibrary.cpp"
             ,0x111);
  pRVar3 = Memory::Recycler::TrackAllocInfo((Recycler *)pDVar9,&local_c8);
  local_d8 = Memory::Recycler::AllocInlined;
  local_d0 = 0;
  this_02 = (JavascriptNumberObject *)new<Memory::Recycler>(0x28,pRVar3,0x43c4b0);
  value = TaggedInt::ToVarUnchecked(0);
  JavascriptNumberObject::JavascriptNumberObject(this_02,value,(DynamicType *)tempType);
  Memory::WriteBarrierPtr<Js::DynamicObject>::operator=
            (&(this->super_JavascriptLibraryBase).numberPrototype,(DynamicObject *)this_02);
  local_e0 = (nullptr_t)0x0;
  Memory::WriteBarrierPtr<Js::DynamicObject>::operator=
            (&(this->super_JavascriptLibraryBase).bigintPrototype,&local_e0);
  pSVar11 = Memory::WriteBarrierPtr<Js::ScriptContext>::operator->
                      (&(this->super_JavascriptLibraryBase).scriptContext);
  pSVar12 = ScriptContext::GetConfig(pSVar11);
  bVar1 = ScriptConfiguration::IsESBigIntEnabled(pSVar12);
  if (bVar1) {
    ppSVar2 = Memory::WriteBarrierPtr::operator_cast_to_ScriptContext__
                        ((WriteBarrierPtr *)&(this->super_JavascriptLibraryBase).scriptContext);
    pSVar11 = *ppSVar2;
    ppOVar8 = Memory::WriteBarrierPtr::operator_cast_to_ObjectPrototypeObject__
                        ((WriteBarrierPtr *)&(this->super_JavascriptLibraryBase).objectPrototype);
    pOVar7 = *ppOVar8;
    typeHandler_20 =
         DeferredTypeHandler<&Js::JavascriptLibrary::InitializeBigIntPrototype,_Js::DefaultDeferredTypeFilter,_true,_(unsigned_short)0,_(unsigned_short)0>
         ::GetDefaultInstance();
    tempType = &DynamicType::New(pSVar11,TypeIds_BigIntObject,(RecyclableObject *)pOVar7,
                                 (JavascriptMethod)0x0,(DynamicTypeHandler *)typeHandler_20,false,
                                 false)->super_Type;
    pDVar9 = tempDynamicType;
    Memory::TrackAllocData::CreateTrackAllocData
              (&local_108,(type_info *)&JavascriptBigIntObject::typeinfo,0,0xffffffffffffffff,
               "/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Runtime/Library/JavascriptLibrary.cpp"
               ,0x118);
    pRVar3 = Memory::Recycler::TrackAllocInfo((Recycler *)pDVar9,&local_108);
    local_118 = Memory::Recycler::AllocInlined;
    local_110 = 0;
    this_03 = (JavascriptBigIntObject *)new<Memory::Recycler>(0x28,pRVar3,0x43c4b0);
    JavascriptBigIntObject::JavascriptBigIntObject
              (this_03,(JavascriptBigInt *)0x0,(DynamicType *)tempType);
    Memory::WriteBarrierPtr<Js::DynamicObject>::operator=
              (&(this->super_JavascriptLibraryBase).bigintPrototype,(DynamicObject *)this_03);
  }
  ppSVar2 = Memory::WriteBarrierPtr::operator_cast_to_ScriptContext__
                      ((WriteBarrierPtr *)&(this->super_JavascriptLibraryBase).scriptContext);
  pSVar11 = *ppSVar2;
  ppOVar8 = Memory::WriteBarrierPtr::operator_cast_to_ObjectPrototypeObject__
                      ((WriteBarrierPtr *)&(this->super_JavascriptLibraryBase).objectPrototype);
  pOVar7 = *ppOVar8;
  typeHandler_21 =
       DeferredTypeHandler<&Js::JavascriptLibrary::InitializeStringPrototype,_Js::DefaultDeferredTypeFilter,_true,_(unsigned_short)0,_(unsigned_short)0>
       ::GetDefaultInstance();
  tempType = &DynamicType::New(pSVar11,TypeIds_StringObject,(RecyclableObject *)pOVar7,
                               (JavascriptMethod)0x0,(DynamicTypeHandler *)typeHandler_21,false,
                               false)->super_Type;
  pDVar9 = tempDynamicType;
  Memory::TrackAllocData::CreateTrackAllocData
            (&local_140,(type_info *)&JavascriptStringObject::typeinfo,0,0xffffffffffffffff,
             "/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Runtime/Library/JavascriptLibrary.cpp"
             ,0x11d);
  pRVar3 = Memory::Recycler::TrackAllocInfo((Recycler *)pDVar9,&local_140);
  initDateValue = (double)Memory::Recycler::AllocInlined;
  local_148 = 0;
  this_04 = (JavascriptStringObject *)new<Memory::Recycler>(0x28,pRVar3,0x43c4b0);
  JavascriptStringObject::JavascriptStringObject
            (this_04,(JavascriptString *)0x0,(DynamicType *)tempType);
  Memory::WriteBarrierPtr<Js::DynamicObject>::operator=
            (&(this->super_JavascriptLibraryBase).stringPrototype,(DynamicObject *)this_04);
  pSVar11 = Memory::WriteBarrierPtr<Js::ScriptContext>::operator->
                      (&(this->super_JavascriptLibraryBase).scriptContext);
  pSVar12 = ScriptContext::GetConfig(pSVar11);
  bVar1 = ScriptConfiguration::IsES6PrototypeChain(pSVar12);
  pDVar9 = tempDynamicType;
  if (bVar1) {
    ppSVar2 = Memory::WriteBarrierPtr::operator_cast_to_ScriptContext__
                        ((WriteBarrierPtr *)&(this->super_JavascriptLibraryBase).scriptContext);
    pSVar11 = *ppSVar2;
    ppOVar8 = Memory::WriteBarrierPtr::operator_cast_to_ObjectPrototypeObject__
                        ((WriteBarrierPtr *)&(this->super_JavascriptLibraryBase).objectPrototype);
    pOVar7 = *ppOVar8;
    pDVar14 = DeferredTypeHandler<&Js::JavascriptLibrary::InitializeDatePrototype,_Js::DefaultDeferredTypeFilter,_true,_(unsigned_short)0,_(unsigned_short)0>
              ::GetDefaultInstance();
    pDVar6 = DynamicType::New(pSVar11,TypeIds_Object,(RecyclableObject *)pOVar7,
                              (JavascriptMethod)0x0,(DynamicTypeHandler *)pDVar14,false,false);
    pDVar10 = DynamicObject::New((Recycler *)pDVar9,pDVar6);
    Memory::WriteBarrierPtr<Js::DynamicObject>::operator=
              (&(this->super_JavascriptLibraryBase).datePrototype,pDVar10);
    pDVar9 = tempDynamicType;
    ppSVar2 = Memory::WriteBarrierPtr::operator_cast_to_ScriptContext__
                        ((WriteBarrierPtr *)&(this->super_JavascriptLibraryBase).scriptContext);
    pSVar11 = *ppSVar2;
    ppOVar8 = Memory::WriteBarrierPtr::operator_cast_to_ObjectPrototypeObject__
                        ((WriteBarrierPtr *)&(this->super_JavascriptLibraryBase).objectPrototype);
    pOVar7 = *ppOVar8;
    typeHandler_22 =
         DeferredTypeHandler<&Js::JavascriptLibrary::InitializeRegexPrototype,_Js::DefaultDeferredTypeFilter,_true,_(unsigned_short)0,_(unsigned_short)0>
         ::GetDefaultInstance();
    pDVar6 = DynamicType::New(pSVar11,TypeIds_Object,(RecyclableObject *)pOVar7,
                              (JavascriptMethod)0x0,(DynamicTypeHandler *)typeHandler_22,false,false
                             );
    pDVar10 = DynamicObject::New((Recycler *)pDVar9,pDVar6);
    Memory::WriteBarrierPtr<Js::DynamicObject>::operator=
              (&(this->super_JavascriptLibraryBase).regexPrototype,pDVar10);
    pDVar9 = tempDynamicType;
    ppSVar2 = Memory::WriteBarrierPtr::operator_cast_to_ScriptContext__
                        ((WriteBarrierPtr *)&(this->super_JavascriptLibraryBase).scriptContext);
    pSVar11 = *ppSVar2;
    ppOVar8 = Memory::WriteBarrierPtr::operator_cast_to_ObjectPrototypeObject__
                        ((WriteBarrierPtr *)&(this->super_JavascriptLibraryBase).objectPrototype);
    pOVar7 = *ppOVar8;
    pDVar15 = DeferredTypeHandler<&Js::JavascriptLibrary::InitializeErrorPrototype,_Js::DefaultDeferredTypeFilter,_true,_(unsigned_short)0,_(unsigned_short)0>
              ::GetDefaultInstance();
    pDVar6 = DynamicType::New(pSVar11,TypeIds_Object,(RecyclableObject *)pOVar7,
                              (JavascriptMethod)0x0,(DynamicTypeHandler *)pDVar15,false,false);
    pDVar10 = DynamicObject::New((Recycler *)pDVar9,pDVar6);
    Memory::WriteBarrierPtr<Js::DynamicObject>::operator=
              (&(this->super_JavascriptLibraryBase).errorPrototype,pDVar10);
  }
  else {
    local_158 = NumberConstants::NaN;
    pTVar27 = &(this->super_JavascriptLibraryBase).scriptContext;
    ppSVar2 = Memory::WriteBarrierPtr::operator_cast_to_ScriptContext__((WriteBarrierPtr *)pTVar27);
    pSVar11 = *ppSVar2;
    pTVar28 = &(this->super_JavascriptLibraryBase).objectPrototype;
    ppOVar8 = Memory::WriteBarrierPtr::operator_cast_to_ObjectPrototypeObject__
                        ((WriteBarrierPtr *)pTVar28);
    pOVar7 = *ppOVar8;
    pDVar14 = DeferredTypeHandler<&Js::JavascriptLibrary::InitializeDatePrototype,_Js::DefaultDeferredTypeFilter,_true,_(unsigned_short)0,_(unsigned_short)0>
              ::GetDefaultInstance();
    tempType = &DynamicType::New(pSVar11,TypeIds_Date,(RecyclableObject *)pOVar7,
                                 (JavascriptMethod)0x0,(DynamicTypeHandler *)pDVar14,false,false)->
                super_Type;
    pDVar9 = tempDynamicType;
    Memory::TrackAllocData::CreateTrackAllocData
              (&local_180,(type_info *)&JavascriptDate::typeinfo,0,0xffffffffffffffff,
               "/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Runtime/Library/JavascriptLibrary.cpp"
               ,0x133);
    pRVar3 = Memory::Recycler::TrackAllocInfo((Recycler *)pDVar9,&local_180);
    local_190 = Memory::Recycler::AllocZeroInlined;
    local_188 = 0;
    this_05 = (JavascriptDate *)new<Memory::Recycler>(0x80,pRVar3,0x744a10);
    JavascriptDate::JavascriptDate(this_05,local_158,(DynamicType *)tempType);
    Memory::WriteBarrierPtr<Js::DynamicObject>::operator=
              (&(this->super_JavascriptLibraryBase).datePrototype,(DynamicObject *)this_05);
    ppSVar2 = Memory::WriteBarrierPtr::operator_cast_to_ScriptContext__((WriteBarrierPtr *)pTVar27);
    pSVar11 = *ppSVar2;
    ppOVar8 = Memory::WriteBarrierPtr::operator_cast_to_ObjectPrototypeObject__
                        ((WriteBarrierPtr *)pTVar28);
    pOVar7 = *ppOVar8;
    pDVar15 = DeferredTypeHandler<&Js::JavascriptLibrary::InitializeErrorPrototype,_Js::DefaultDeferredTypeFilter,_true,_(unsigned_short)0,_(unsigned_short)0>
              ::GetDefaultInstance();
    tempType = &DynamicType::New(pSVar11,TypeIds_Error,(RecyclableObject *)pOVar7,
                                 (JavascriptMethod)0x0,(DynamicTypeHandler *)pDVar15,false,false)->
                super_Type;
    pRVar3 = GetRecycler(this);
    Memory::TrackAllocData::CreateTrackAllocData
              (&local_1b8,(type_info *)&JavascriptError::typeinfo,0,0xffffffffffffffff,
               "/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Runtime/Library/JavascriptLibrary.cpp"
               ,0x137);
    pRVar3 = Memory::Recycler::TrackAllocInfo(pRVar3,&local_1b8);
    local_1c8 = Memory::Recycler::AllocInlined;
    local_1c0 = 0;
    pJVar16 = (JavascriptError *)new<Memory::Recycler>(0x40,pRVar3,0x43c4b0);
    JavascriptError::JavascriptError(pJVar16,(DynamicType *)tempType,0,1);
    Memory::WriteBarrierPtr<Js::DynamicObject>::operator=
              (&(this->super_JavascriptLibraryBase).errorPrototype,(DynamicObject *)pJVar16);
  }
  pSVar11 = Memory::WriteBarrierPtr<Js::ScriptContext>::operator->
                      (&(this->super_JavascriptLibraryBase).scriptContext);
  pSVar12 = ScriptContext::GetConfig(pSVar11);
  bVar1 = ScriptConfiguration::IsES6PrototypeChain(pSVar12);
  pDVar9 = tempDynamicType;
  if (bVar1) {
    ppSVar2 = Memory::WriteBarrierPtr::operator_cast_to_ScriptContext__
                        ((WriteBarrierPtr *)&(this->super_JavascriptLibraryBase).scriptContext);
    pSVar11 = *ppSVar2;
    ppDVar13 = Memory::WriteBarrierPtr::operator_cast_to_DynamicObject__
                         ((WriteBarrierPtr *)&(this->super_JavascriptLibraryBase).errorPrototype);
    pDVar10 = *ppDVar13;
    pDVar17 = DeferredTypeHandler<&Js::JavascriptLibrary::InitializeEvalErrorPrototype,_Js::DefaultDeferredTypeFilter,_true,_(unsigned_short)0,_(unsigned_short)0>
              ::GetDefaultInstance();
    pDVar6 = DynamicType::New(pSVar11,TypeIds_Object,&pDVar10->super_RecyclableObject,
                              (JavascriptMethod)0x0,(DynamicTypeHandler *)pDVar17,false,false);
    pDVar10 = DynamicObject::New((Recycler *)pDVar9,pDVar6);
    Memory::WriteBarrierPtr<Js::DynamicObject>::operator=
              (&(this->super_JavascriptLibraryBase).evalErrorPrototype,pDVar10);
  }
  else {
    ppSVar2 = Memory::WriteBarrierPtr::operator_cast_to_ScriptContext__
                        ((WriteBarrierPtr *)&(this->super_JavascriptLibraryBase).scriptContext);
    pSVar11 = *ppSVar2;
    ppDVar13 = Memory::WriteBarrierPtr::operator_cast_to_DynamicObject__
                         ((WriteBarrierPtr *)&(this->super_JavascriptLibraryBase).errorPrototype);
    pDVar10 = *ppDVar13;
    pDVar17 = DeferredTypeHandler<&Js::JavascriptLibrary::InitializeEvalErrorPrototype,_Js::DefaultDeferredTypeFilter,_true,_(unsigned_short)0,_(unsigned_short)0>
              ::GetDefaultInstance();
    tempType = &DynamicType::New(pSVar11,TypeIds_Error,&pDVar10->super_RecyclableObject,
                                 (JavascriptMethod)0x0,(DynamicTypeHandler *)pDVar17,false,false)->
                super_Type;
    pRVar3 = GetRecycler(this);
    Memory::TrackAllocData::CreateTrackAllocData
              (&local_1f0,(type_info *)&JavascriptError::typeinfo,0,0xffffffffffffffff,
               "/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Runtime/Library/JavascriptLibrary.cpp"
               ,0x148);
    pRVar3 = Memory::Recycler::TrackAllocInfo(pRVar3,&local_1f0);
    local_200 = Memory::Recycler::AllocInlined;
    local_1f8 = 0;
    pJVar16 = (JavascriptError *)new<Memory::Recycler>(0x40,pRVar3,0x43c4b0);
    JavascriptError::JavascriptError(pJVar16,(DynamicType *)tempType,0,1);
    Memory::WriteBarrierPtr<Js::DynamicObject>::operator=
              (&(this->super_JavascriptLibraryBase).evalErrorPrototype,(DynamicObject *)pJVar16);
  }
  pSVar11 = Memory::WriteBarrierPtr<Js::ScriptContext>::operator->
                      (&(this->super_JavascriptLibraryBase).scriptContext);
  pSVar12 = ScriptContext::GetConfig(pSVar11);
  bVar1 = ScriptConfiguration::IsES6PrototypeChain(pSVar12);
  pDVar9 = tempDynamicType;
  if (bVar1) {
    ppSVar2 = Memory::WriteBarrierPtr::operator_cast_to_ScriptContext__
                        ((WriteBarrierPtr *)&(this->super_JavascriptLibraryBase).scriptContext);
    pSVar11 = *ppSVar2;
    ppDVar13 = Memory::WriteBarrierPtr::operator_cast_to_DynamicObject__
                         ((WriteBarrierPtr *)&(this->super_JavascriptLibraryBase).errorPrototype);
    pDVar10 = *ppDVar13;
    pDVar18 = DeferredTypeHandler<&Js::JavascriptLibrary::InitializeRangeErrorPrototype,_Js::DefaultDeferredTypeFilter,_true,_(unsigned_short)0,_(unsigned_short)0>
              ::GetDefaultInstance();
    pDVar6 = DynamicType::New(pSVar11,TypeIds_Object,&pDVar10->super_RecyclableObject,
                              (JavascriptMethod)0x0,(DynamicTypeHandler *)pDVar18,false,false);
    pDVar10 = DynamicObject::New((Recycler *)pDVar9,pDVar6);
    Memory::WriteBarrierPtr<Js::DynamicObject>::operator=
              (&(this->super_JavascriptLibraryBase).rangeErrorPrototype,pDVar10);
  }
  else {
    ppSVar2 = Memory::WriteBarrierPtr::operator_cast_to_ScriptContext__
                        ((WriteBarrierPtr *)&(this->super_JavascriptLibraryBase).scriptContext);
    pSVar11 = *ppSVar2;
    ppDVar13 = Memory::WriteBarrierPtr::operator_cast_to_DynamicObject__
                         ((WriteBarrierPtr *)&(this->super_JavascriptLibraryBase).errorPrototype);
    pDVar10 = *ppDVar13;
    pDVar18 = DeferredTypeHandler<&Js::JavascriptLibrary::InitializeRangeErrorPrototype,_Js::DefaultDeferredTypeFilter,_true,_(unsigned_short)0,_(unsigned_short)0>
              ::GetDefaultInstance();
    tempType = &DynamicType::New(pSVar11,TypeIds_Error,&pDVar10->super_RecyclableObject,
                                 (JavascriptMethod)0x0,(DynamicTypeHandler *)pDVar18,false,false)->
                super_Type;
    pRVar3 = GetRecycler(this);
    Memory::TrackAllocData::CreateTrackAllocData
              (&local_228,(type_info *)&JavascriptError::typeinfo,0,0xffffffffffffffff,
               "/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Runtime/Library/JavascriptLibrary.cpp"
               ,0x149);
    pRVar3 = Memory::Recycler::TrackAllocInfo(pRVar3,&local_228);
    local_238 = Memory::Recycler::AllocInlined;
    local_230 = 0;
    pJVar16 = (JavascriptError *)new<Memory::Recycler>(0x40,pRVar3,0x43c4b0);
    JavascriptError::JavascriptError(pJVar16,(DynamicType *)tempType,0,1);
    Memory::WriteBarrierPtr<Js::DynamicObject>::operator=
              (&(this->super_JavascriptLibraryBase).rangeErrorPrototype,(DynamicObject *)pJVar16);
  }
  pSVar11 = Memory::WriteBarrierPtr<Js::ScriptContext>::operator->
                      (&(this->super_JavascriptLibraryBase).scriptContext);
  pSVar12 = ScriptContext::GetConfig(pSVar11);
  bVar1 = ScriptConfiguration::IsES6PrototypeChain(pSVar12);
  pDVar9 = tempDynamicType;
  if (bVar1) {
    ppSVar2 = Memory::WriteBarrierPtr::operator_cast_to_ScriptContext__
                        ((WriteBarrierPtr *)&(this->super_JavascriptLibraryBase).scriptContext);
    pSVar11 = *ppSVar2;
    ppDVar13 = Memory::WriteBarrierPtr::operator_cast_to_DynamicObject__
                         ((WriteBarrierPtr *)&(this->super_JavascriptLibraryBase).errorPrototype);
    pDVar10 = *ppDVar13;
    pDVar19 = DeferredTypeHandler<&Js::JavascriptLibrary::InitializeReferenceErrorPrototype,_Js::DefaultDeferredTypeFilter,_true,_(unsigned_short)0,_(unsigned_short)0>
              ::GetDefaultInstance();
    pDVar6 = DynamicType::New(pSVar11,TypeIds_Object,&pDVar10->super_RecyclableObject,
                              (JavascriptMethod)0x0,(DynamicTypeHandler *)pDVar19,false,false);
    pDVar10 = DynamicObject::New((Recycler *)pDVar9,pDVar6);
    Memory::WriteBarrierPtr<Js::DynamicObject>::operator=
              (&(this->super_JavascriptLibraryBase).referenceErrorPrototype,pDVar10);
  }
  else {
    ppSVar2 = Memory::WriteBarrierPtr::operator_cast_to_ScriptContext__
                        ((WriteBarrierPtr *)&(this->super_JavascriptLibraryBase).scriptContext);
    pSVar11 = *ppSVar2;
    ppDVar13 = Memory::WriteBarrierPtr::operator_cast_to_DynamicObject__
                         ((WriteBarrierPtr *)&(this->super_JavascriptLibraryBase).errorPrototype);
    pDVar10 = *ppDVar13;
    pDVar19 = DeferredTypeHandler<&Js::JavascriptLibrary::InitializeReferenceErrorPrototype,_Js::DefaultDeferredTypeFilter,_true,_(unsigned_short)0,_(unsigned_short)0>
              ::GetDefaultInstance();
    tempType = &DynamicType::New(pSVar11,TypeIds_Error,&pDVar10->super_RecyclableObject,
                                 (JavascriptMethod)0x0,(DynamicTypeHandler *)pDVar19,false,false)->
                super_Type;
    pRVar3 = GetRecycler(this);
    Memory::TrackAllocData::CreateTrackAllocData
              (&local_260,(type_info *)&JavascriptError::typeinfo,0,0xffffffffffffffff,
               "/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Runtime/Library/JavascriptLibrary.cpp"
               ,0x14a);
    pRVar3 = Memory::Recycler::TrackAllocInfo(pRVar3,&local_260);
    local_270 = Memory::Recycler::AllocInlined;
    local_268 = 0;
    pJVar16 = (JavascriptError *)new<Memory::Recycler>(0x40,pRVar3,0x43c4b0);
    JavascriptError::JavascriptError(pJVar16,(DynamicType *)tempType,0,1);
    Memory::WriteBarrierPtr<Js::DynamicObject>::operator=
              (&(this->super_JavascriptLibraryBase).referenceErrorPrototype,(DynamicObject *)pJVar16
              );
  }
  pSVar11 = Memory::WriteBarrierPtr<Js::ScriptContext>::operator->
                      (&(this->super_JavascriptLibraryBase).scriptContext);
  pSVar12 = ScriptContext::GetConfig(pSVar11);
  bVar1 = ScriptConfiguration::IsES6PrototypeChain(pSVar12);
  pDVar9 = tempDynamicType;
  if (bVar1) {
    ppSVar2 = Memory::WriteBarrierPtr::operator_cast_to_ScriptContext__
                        ((WriteBarrierPtr *)&(this->super_JavascriptLibraryBase).scriptContext);
    pSVar11 = *ppSVar2;
    ppDVar13 = Memory::WriteBarrierPtr::operator_cast_to_DynamicObject__
                         ((WriteBarrierPtr *)&(this->super_JavascriptLibraryBase).errorPrototype);
    pDVar10 = *ppDVar13;
    pDVar20 = DeferredTypeHandler<&Js::JavascriptLibrary::InitializeSyntaxErrorPrototype,_Js::DefaultDeferredTypeFilter,_true,_(unsigned_short)0,_(unsigned_short)0>
              ::GetDefaultInstance();
    pDVar6 = DynamicType::New(pSVar11,TypeIds_Object,&pDVar10->super_RecyclableObject,
                              (JavascriptMethod)0x0,(DynamicTypeHandler *)pDVar20,false,false);
    pDVar10 = DynamicObject::New((Recycler *)pDVar9,pDVar6);
    Memory::WriteBarrierPtr<Js::DynamicObject>::operator=
              (&(this->super_JavascriptLibraryBase).syntaxErrorPrototype,pDVar10);
  }
  else {
    ppSVar2 = Memory::WriteBarrierPtr::operator_cast_to_ScriptContext__
                        ((WriteBarrierPtr *)&(this->super_JavascriptLibraryBase).scriptContext);
    pSVar11 = *ppSVar2;
    ppDVar13 = Memory::WriteBarrierPtr::operator_cast_to_DynamicObject__
                         ((WriteBarrierPtr *)&(this->super_JavascriptLibraryBase).errorPrototype);
    pDVar10 = *ppDVar13;
    pDVar20 = DeferredTypeHandler<&Js::JavascriptLibrary::InitializeSyntaxErrorPrototype,_Js::DefaultDeferredTypeFilter,_true,_(unsigned_short)0,_(unsigned_short)0>
              ::GetDefaultInstance();
    tempType = &DynamicType::New(pSVar11,TypeIds_Error,&pDVar10->super_RecyclableObject,
                                 (JavascriptMethod)0x0,(DynamicTypeHandler *)pDVar20,false,false)->
                super_Type;
    pRVar3 = GetRecycler(this);
    Memory::TrackAllocData::CreateTrackAllocData
              (&local_298,(type_info *)&JavascriptError::typeinfo,0,0xffffffffffffffff,
               "/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Runtime/Library/JavascriptLibrary.cpp"
               ,0x14b);
    pRVar3 = Memory::Recycler::TrackAllocInfo(pRVar3,&local_298);
    local_2a8 = Memory::Recycler::AllocInlined;
    local_2a0 = 0;
    pJVar16 = (JavascriptError *)new<Memory::Recycler>(0x40,pRVar3,0x43c4b0);
    JavascriptError::JavascriptError(pJVar16,(DynamicType *)tempType,0,1);
    Memory::WriteBarrierPtr<Js::DynamicObject>::operator=
              (&(this->super_JavascriptLibraryBase).syntaxErrorPrototype,(DynamicObject *)pJVar16);
  }
  pSVar11 = Memory::WriteBarrierPtr<Js::ScriptContext>::operator->
                      (&(this->super_JavascriptLibraryBase).scriptContext);
  pSVar12 = ScriptContext::GetConfig(pSVar11);
  bVar1 = ScriptConfiguration::IsES6PrototypeChain(pSVar12);
  pDVar9 = tempDynamicType;
  if (bVar1) {
    ppSVar2 = Memory::WriteBarrierPtr::operator_cast_to_ScriptContext__
                        ((WriteBarrierPtr *)&(this->super_JavascriptLibraryBase).scriptContext);
    pSVar11 = *ppSVar2;
    ppDVar13 = Memory::WriteBarrierPtr::operator_cast_to_DynamicObject__
                         ((WriteBarrierPtr *)&(this->super_JavascriptLibraryBase).errorPrototype);
    pDVar10 = *ppDVar13;
    pDVar21 = DeferredTypeHandler<&Js::JavascriptLibrary::InitializeTypeErrorPrototype,_Js::DefaultDeferredTypeFilter,_true,_(unsigned_short)0,_(unsigned_short)0>
              ::GetDefaultInstance();
    pDVar6 = DynamicType::New(pSVar11,TypeIds_Object,&pDVar10->super_RecyclableObject,
                              (JavascriptMethod)0x0,(DynamicTypeHandler *)pDVar21,false,false);
    pDVar10 = DynamicObject::New((Recycler *)pDVar9,pDVar6);
    Memory::WriteBarrierPtr<Js::DynamicObject>::operator=
              (&(this->super_JavascriptLibraryBase).typeErrorPrototype,pDVar10);
  }
  else {
    ppSVar2 = Memory::WriteBarrierPtr::operator_cast_to_ScriptContext__
                        ((WriteBarrierPtr *)&(this->super_JavascriptLibraryBase).scriptContext);
    pSVar11 = *ppSVar2;
    ppDVar13 = Memory::WriteBarrierPtr::operator_cast_to_DynamicObject__
                         ((WriteBarrierPtr *)&(this->super_JavascriptLibraryBase).errorPrototype);
    pDVar10 = *ppDVar13;
    pDVar21 = DeferredTypeHandler<&Js::JavascriptLibrary::InitializeTypeErrorPrototype,_Js::DefaultDeferredTypeFilter,_true,_(unsigned_short)0,_(unsigned_short)0>
              ::GetDefaultInstance();
    tempType = &DynamicType::New(pSVar11,TypeIds_Error,&pDVar10->super_RecyclableObject,
                                 (JavascriptMethod)0x0,(DynamicTypeHandler *)pDVar21,false,false)->
                super_Type;
    pRVar3 = GetRecycler(this);
    Memory::TrackAllocData::CreateTrackAllocData
              (&local_2d0,(type_info *)&JavascriptError::typeinfo,0,0xffffffffffffffff,
               "/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Runtime/Library/JavascriptLibrary.cpp"
               ,0x14c);
    pRVar3 = Memory::Recycler::TrackAllocInfo(pRVar3,&local_2d0);
    local_2e0 = Memory::Recycler::AllocInlined;
    local_2d8 = 0;
    pJVar16 = (JavascriptError *)new<Memory::Recycler>(0x40,pRVar3,0x43c4b0);
    JavascriptError::JavascriptError(pJVar16,(DynamicType *)tempType,0,1);
    Memory::WriteBarrierPtr<Js::DynamicObject>::operator=
              (&(this->super_JavascriptLibraryBase).typeErrorPrototype,(DynamicObject *)pJVar16);
  }
  pSVar11 = Memory::WriteBarrierPtr<Js::ScriptContext>::operator->
                      (&(this->super_JavascriptLibraryBase).scriptContext);
  pSVar12 = ScriptContext::GetConfig(pSVar11);
  bVar1 = ScriptConfiguration::IsES6PrototypeChain(pSVar12);
  pDVar9 = tempDynamicType;
  if (bVar1) {
    ppSVar2 = Memory::WriteBarrierPtr::operator_cast_to_ScriptContext__
                        ((WriteBarrierPtr *)&(this->super_JavascriptLibraryBase).scriptContext);
    pSVar11 = *ppSVar2;
    ppDVar13 = Memory::WriteBarrierPtr::operator_cast_to_DynamicObject__
                         ((WriteBarrierPtr *)&(this->super_JavascriptLibraryBase).errorPrototype);
    pDVar10 = *ppDVar13;
    pDVar22 = DeferredTypeHandler<&Js::JavascriptLibrary::InitializeURIErrorPrototype,_Js::DefaultDeferredTypeFilter,_true,_(unsigned_short)0,_(unsigned_short)0>
              ::GetDefaultInstance();
    pDVar6 = DynamicType::New(pSVar11,TypeIds_Object,&pDVar10->super_RecyclableObject,
                              (JavascriptMethod)0x0,(DynamicTypeHandler *)pDVar22,false,false);
    pDVar10 = DynamicObject::New((Recycler *)pDVar9,pDVar6);
    Memory::WriteBarrierPtr<Js::DynamicObject>::operator=
              (&(this->super_JavascriptLibraryBase).uriErrorPrototype,pDVar10);
  }
  else {
    ppSVar2 = Memory::WriteBarrierPtr::operator_cast_to_ScriptContext__
                        ((WriteBarrierPtr *)&(this->super_JavascriptLibraryBase).scriptContext);
    pSVar11 = *ppSVar2;
    ppDVar13 = Memory::WriteBarrierPtr::operator_cast_to_DynamicObject__
                         ((WriteBarrierPtr *)&(this->super_JavascriptLibraryBase).errorPrototype);
    pDVar10 = *ppDVar13;
    pDVar22 = DeferredTypeHandler<&Js::JavascriptLibrary::InitializeURIErrorPrototype,_Js::DefaultDeferredTypeFilter,_true,_(unsigned_short)0,_(unsigned_short)0>
              ::GetDefaultInstance();
    tempType = &DynamicType::New(pSVar11,TypeIds_Error,&pDVar10->super_RecyclableObject,
                                 (JavascriptMethod)0x0,(DynamicTypeHandler *)pDVar22,false,false)->
                super_Type;
    pRVar3 = GetRecycler(this);
    Memory::TrackAllocData::CreateTrackAllocData
              (&local_308,(type_info *)&JavascriptError::typeinfo,0,0xffffffffffffffff,
               "/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Runtime/Library/JavascriptLibrary.cpp"
               ,0x14d);
    pRVar3 = Memory::Recycler::TrackAllocInfo(pRVar3,&local_308);
    local_318 = Memory::Recycler::AllocInlined;
    local_310 = 0;
    pJVar16 = (JavascriptError *)new<Memory::Recycler>(0x40,pRVar3,0x43c4b0);
    JavascriptError::JavascriptError(pJVar16,(DynamicType *)tempType,0,1);
    Memory::WriteBarrierPtr<Js::DynamicObject>::operator=
              (&(this->super_JavascriptLibraryBase).uriErrorPrototype,(DynamicObject *)pJVar16);
  }
  pSVar11 = Memory::WriteBarrierPtr<Js::ScriptContext>::operator->
                      (&(this->super_JavascriptLibraryBase).scriptContext);
  pSVar12 = ScriptContext::GetConfig(pSVar11);
  bVar1 = ScriptConfiguration::IsES6PrototypeChain(pSVar12);
  pDVar9 = tempDynamicType;
  if (bVar1) {
    ppSVar2 = Memory::WriteBarrierPtr::operator_cast_to_ScriptContext__
                        ((WriteBarrierPtr *)&(this->super_JavascriptLibraryBase).scriptContext);
    pSVar11 = *ppSVar2;
    ppDVar13 = Memory::WriteBarrierPtr::operator_cast_to_DynamicObject__
                         ((WriteBarrierPtr *)&(this->super_JavascriptLibraryBase).errorPrototype);
    pDVar10 = *ppDVar13;
    pDVar23 = DeferredTypeHandler<&Js::JavascriptLibrary::InitializeAggregateErrorPrototype,_Js::DefaultDeferredTypeFilter,_true,_(unsigned_short)0,_(unsigned_short)0>
              ::GetDefaultInstance();
    pDVar6 = DynamicType::New(pSVar11,TypeIds_Object,&pDVar10->super_RecyclableObject,
                              (JavascriptMethod)0x0,(DynamicTypeHandler *)pDVar23,false,false);
    pDVar10 = DynamicObject::New((Recycler *)pDVar9,pDVar6);
    Memory::WriteBarrierPtr<Js::DynamicObject>::operator=
              (&(this->super_JavascriptLibraryBase).aggregateErrorPrototype,pDVar10);
  }
  else {
    ppSVar2 = Memory::WriteBarrierPtr::operator_cast_to_ScriptContext__
                        ((WriteBarrierPtr *)&(this->super_JavascriptLibraryBase).scriptContext);
    pSVar11 = *ppSVar2;
    ppDVar13 = Memory::WriteBarrierPtr::operator_cast_to_DynamicObject__
                         ((WriteBarrierPtr *)&(this->super_JavascriptLibraryBase).errorPrototype);
    pDVar10 = *ppDVar13;
    pDVar23 = DeferredTypeHandler<&Js::JavascriptLibrary::InitializeAggregateErrorPrototype,_Js::DefaultDeferredTypeFilter,_true,_(unsigned_short)0,_(unsigned_short)0>
              ::GetDefaultInstance();
    tempType = &DynamicType::New(pSVar11,TypeIds_Error,&pDVar10->super_RecyclableObject,
                                 (JavascriptMethod)0x0,(DynamicTypeHandler *)pDVar23,false,false)->
                super_Type;
    pRVar3 = GetRecycler(this);
    Memory::TrackAllocData::CreateTrackAllocData
              (&local_340,(type_info *)&JavascriptError::typeinfo,0,0xffffffffffffffff,
               "/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Runtime/Library/JavascriptLibrary.cpp"
               ,0x14e);
    pRVar3 = Memory::Recycler::TrackAllocInfo(pRVar3,&local_340);
    local_350 = Memory::Recycler::AllocInlined;
    local_348 = 0;
    pJVar16 = (JavascriptError *)new<Memory::Recycler>(0x40,pRVar3,0x43c4b0);
    JavascriptError::JavascriptError(pJVar16,(DynamicType *)tempType,0,1);
    Memory::WriteBarrierPtr<Js::DynamicObject>::operator=
              (&(this->super_JavascriptLibraryBase).aggregateErrorPrototype,(DynamicObject *)pJVar16
              );
  }
  if (((DAT_01e9e23b & 1) != 0) && (bVar1 = PhaseIsEnabled::WasmPhase(), bVar1)) {
    pSVar11 = Memory::WriteBarrierPtr<Js::ScriptContext>::operator->
                        (&(this->super_JavascriptLibraryBase).scriptContext);
    pSVar12 = ScriptContext::GetConfig(pSVar11);
    bVar1 = ScriptConfiguration::IsES6PrototypeChain(pSVar12);
    pDVar9 = tempDynamicType;
    if (bVar1) {
      ppSVar2 = Memory::WriteBarrierPtr::operator_cast_to_ScriptContext__
                          ((WriteBarrierPtr *)&(this->super_JavascriptLibraryBase).scriptContext);
      pSVar11 = *ppSVar2;
      ppDVar13 = Memory::WriteBarrierPtr::operator_cast_to_DynamicObject__
                           ((WriteBarrierPtr *)&(this->super_JavascriptLibraryBase).errorPrototype);
      pDVar10 = *ppDVar13;
      pDVar24 = DeferredTypeHandler<&Js::JavascriptLibrary::InitializeWebAssemblyCompileErrorPrototype,_Js::DefaultDeferredTypeFilter,_true,_(unsigned_short)0,_(unsigned_short)0>
                ::GetDefaultInstance();
      pDVar6 = DynamicType::New(pSVar11,TypeIds_Object,&pDVar10->super_RecyclableObject,
                                (JavascriptMethod)0x0,(DynamicTypeHandler *)pDVar24,false,false);
      pDVar10 = DynamicObject::New((Recycler *)pDVar9,pDVar6);
      Memory::WriteBarrierPtr<Js::DynamicObject>::operator=
                (&this->webAssemblyCompileErrorPrototype,pDVar10);
    }
    else {
      ppSVar2 = Memory::WriteBarrierPtr::operator_cast_to_ScriptContext__
                          ((WriteBarrierPtr *)&(this->super_JavascriptLibraryBase).scriptContext);
      pSVar11 = *ppSVar2;
      ppDVar13 = Memory::WriteBarrierPtr::operator_cast_to_DynamicObject__
                           ((WriteBarrierPtr *)&(this->super_JavascriptLibraryBase).errorPrototype);
      pDVar10 = *ppDVar13;
      pDVar24 = DeferredTypeHandler<&Js::JavascriptLibrary::InitializeWebAssemblyCompileErrorPrototype,_Js::DefaultDeferredTypeFilter,_true,_(unsigned_short)0,_(unsigned_short)0>
                ::GetDefaultInstance();
      tempType = &DynamicType::New(pSVar11,TypeIds_Error,&pDVar10->super_RecyclableObject,
                                   (JavascriptMethod)0x0,(DynamicTypeHandler *)pDVar24,false,false)
                  ->super_Type;
      pRVar3 = GetRecycler(this);
      Memory::TrackAllocData::CreateTrackAllocData
                (&local_378,(type_info *)&JavascriptError::typeinfo,0,0xffffffffffffffff,
                 "/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Runtime/Library/JavascriptLibrary.cpp"
                 ,0x153);
      pRVar3 = Memory::Recycler::TrackAllocInfo(pRVar3,&local_378);
      local_388 = Memory::Recycler::AllocInlined;
      local_380 = 0;
      pJVar16 = (JavascriptError *)new<Memory::Recycler>(0x40,pRVar3,0x43c4b0);
      JavascriptError::JavascriptError(pJVar16,(DynamicType *)tempType,0,1);
      Memory::WriteBarrierPtr<Js::DynamicObject>::operator=
                (&this->webAssemblyCompileErrorPrototype,(DynamicObject *)pJVar16);
    }
    pSVar11 = Memory::WriteBarrierPtr<Js::ScriptContext>::operator->
                        (&(this->super_JavascriptLibraryBase).scriptContext);
    pSVar12 = ScriptContext::GetConfig(pSVar11);
    bVar1 = ScriptConfiguration::IsES6PrototypeChain(pSVar12);
    pDVar9 = tempDynamicType;
    if (bVar1) {
      ppSVar2 = Memory::WriteBarrierPtr::operator_cast_to_ScriptContext__
                          ((WriteBarrierPtr *)&(this->super_JavascriptLibraryBase).scriptContext);
      pSVar11 = *ppSVar2;
      ppDVar13 = Memory::WriteBarrierPtr::operator_cast_to_DynamicObject__
                           ((WriteBarrierPtr *)&(this->super_JavascriptLibraryBase).errorPrototype);
      pDVar10 = *ppDVar13;
      pDVar25 = DeferredTypeHandler<&Js::JavascriptLibrary::InitializeWebAssemblyRuntimeErrorPrototype,_Js::DefaultDeferredTypeFilter,_true,_(unsigned_short)0,_(unsigned_short)0>
                ::GetDefaultInstance();
      pDVar6 = DynamicType::New(pSVar11,TypeIds_Object,&pDVar10->super_RecyclableObject,
                                (JavascriptMethod)0x0,(DynamicTypeHandler *)pDVar25,false,false);
      pDVar10 = DynamicObject::New((Recycler *)pDVar9,pDVar6);
      Memory::WriteBarrierPtr<Js::DynamicObject>::operator=
                (&this->webAssemblyRuntimeErrorPrototype,pDVar10);
    }
    else {
      ppSVar2 = Memory::WriteBarrierPtr::operator_cast_to_ScriptContext__
                          ((WriteBarrierPtr *)&(this->super_JavascriptLibraryBase).scriptContext);
      pSVar11 = *ppSVar2;
      ppDVar13 = Memory::WriteBarrierPtr::operator_cast_to_DynamicObject__
                           ((WriteBarrierPtr *)&(this->super_JavascriptLibraryBase).errorPrototype);
      pDVar10 = *ppDVar13;
      pDVar25 = DeferredTypeHandler<&Js::JavascriptLibrary::InitializeWebAssemblyRuntimeErrorPrototype,_Js::DefaultDeferredTypeFilter,_true,_(unsigned_short)0,_(unsigned_short)0>
                ::GetDefaultInstance();
      tempType = &DynamicType::New(pSVar11,TypeIds_Error,&pDVar10->super_RecyclableObject,
                                   (JavascriptMethod)0x0,(DynamicTypeHandler *)pDVar25,false,false)
                  ->super_Type;
      pRVar3 = GetRecycler(this);
      Memory::TrackAllocData::CreateTrackAllocData
                (&local_3b0,(type_info *)&JavascriptError::typeinfo,0,0xffffffffffffffff,
                 "/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Runtime/Library/JavascriptLibrary.cpp"
                 ,0x154);
      pRVar3 = Memory::Recycler::TrackAllocInfo(pRVar3,&local_3b0);
      local_3c0 = Memory::Recycler::AllocInlined;
      local_3b8 = 0;
      pJVar16 = (JavascriptError *)new<Memory::Recycler>(0x40,pRVar3,0x43c4b0);
      JavascriptError::JavascriptError(pJVar16,(DynamicType *)tempType,0,1);
      Memory::WriteBarrierPtr<Js::DynamicObject>::operator=
                (&this->webAssemblyRuntimeErrorPrototype,(DynamicObject *)pJVar16);
    }
    pSVar11 = Memory::WriteBarrierPtr<Js::ScriptContext>::operator->
                        (&(this->super_JavascriptLibraryBase).scriptContext);
    pSVar12 = ScriptContext::GetConfig(pSVar11);
    bVar1 = ScriptConfiguration::IsES6PrototypeChain(pSVar12);
    pDVar9 = tempDynamicType;
    if (bVar1) {
      ppSVar2 = Memory::WriteBarrierPtr::operator_cast_to_ScriptContext__
                          ((WriteBarrierPtr *)&(this->super_JavascriptLibraryBase).scriptContext);
      pSVar11 = *ppSVar2;
      ppDVar13 = Memory::WriteBarrierPtr::operator_cast_to_DynamicObject__
                           ((WriteBarrierPtr *)&(this->super_JavascriptLibraryBase).errorPrototype);
      pDVar10 = *ppDVar13;
      pDVar26 = DeferredTypeHandler<&Js::JavascriptLibrary::InitializeWebAssemblyLinkErrorPrototype,_Js::DefaultDeferredTypeFilter,_true,_(unsigned_short)0,_(unsigned_short)0>
                ::GetDefaultInstance();
      pDVar6 = DynamicType::New(pSVar11,TypeIds_Object,&pDVar10->super_RecyclableObject,
                                (JavascriptMethod)0x0,(DynamicTypeHandler *)pDVar26,false,false);
      pDVar10 = DynamicObject::New((Recycler *)pDVar9,pDVar6);
      Memory::WriteBarrierPtr<Js::DynamicObject>::operator=
                (&this->webAssemblyLinkErrorPrototype,pDVar10);
    }
    else {
      ppSVar2 = Memory::WriteBarrierPtr::operator_cast_to_ScriptContext__
                          ((WriteBarrierPtr *)&(this->super_JavascriptLibraryBase).scriptContext);
      pSVar11 = *ppSVar2;
      ppDVar13 = Memory::WriteBarrierPtr::operator_cast_to_DynamicObject__
                           ((WriteBarrierPtr *)&(this->super_JavascriptLibraryBase).errorPrototype);
      pDVar10 = *ppDVar13;
      pDVar26 = DeferredTypeHandler<&Js::JavascriptLibrary::InitializeWebAssemblyLinkErrorPrototype,_Js::DefaultDeferredTypeFilter,_true,_(unsigned_short)0,_(unsigned_short)0>
                ::GetDefaultInstance();
      tempType = &DynamicType::New(pSVar11,TypeIds_Error,&pDVar10->super_RecyclableObject,
                                   (JavascriptMethod)0x0,(DynamicTypeHandler *)pDVar26,false,false)
                  ->super_Type;
      pRVar3 = GetRecycler(this);
      Memory::TrackAllocData::CreateTrackAllocData
                (&local_3e8,(type_info *)&JavascriptError::typeinfo,0,0xffffffffffffffff,
                 "/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Runtime/Library/JavascriptLibrary.cpp"
                 ,0x155);
      pRVar3 = Memory::Recycler::TrackAllocInfo(pRVar3,&local_3e8);
      local_3f8 = Memory::Recycler::AllocInlined;
      local_3f0 = 0;
      pJVar16 = (JavascriptError *)new<Memory::Recycler>(0x40,pRVar3,0x43c4b0);
      JavascriptError::JavascriptError(pJVar16,(DynamicType *)tempType,0,1);
      Memory::WriteBarrierPtr<Js::DynamicObject>::operator=
                (&this->webAssemblyLinkErrorPrototype,(DynamicObject *)pJVar16);
    }
  }
  ppSVar2 = Memory::WriteBarrierPtr::operator_cast_to_ScriptContext__
                      ((WriteBarrierPtr *)&(this->super_JavascriptLibraryBase).scriptContext);
  pSVar11 = *ppSVar2;
  ppOVar8 = Memory::WriteBarrierPtr::operator_cast_to_ObjectPrototypeObject__
                      ((WriteBarrierPtr *)&(this->super_JavascriptLibraryBase).objectPrototype);
  pOVar7 = *ppOVar8;
  typeHandler_23 =
       DeferredTypeHandler<&Js::JavascriptLibrary::InitializeFunctionPrototype,_Js::DefaultDeferredTypeFilter,_true,_(unsigned_short)0,_(unsigned_short)0>
       ::GetDefaultInstance();
  tempType = &DynamicType::New(pSVar11,TypeIds_Function,(RecyclableObject *)pOVar7,
                               JavascriptFunction::PrototypeEntryPoint,
                               (DynamicTypeHandler *)typeHandler_23,false,false)->super_Type;
  pDVar9 = tempDynamicType;
  Memory::TrackAllocData::CreateTrackAllocData
            (&local_420,(type_info *)&JavascriptFunction::typeinfo,0,0xffffffffffffffff,
             "/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Runtime/Library/JavascriptLibrary.cpp"
             ,0x15d);
  pRVar3 = Memory::Recycler::TrackAllocInfo((Recycler *)pDVar9,&local_420);
  local_430 = Memory::Recycler::AllocInlined;
  local_428 = 0;
  this_06 = (JavascriptFunction *)new<Memory::Recycler>(0x30,pRVar3,0x43c4b0);
  JavascriptFunction::JavascriptFunction
            (this_06,(DynamicType *)tempType,
             (FunctionInfo *)JavascriptFunction::EntryInfo::PrototypeEntryPoint);
  Memory::WriteBarrierPtr<Js::DynamicObject>::operator=
            (&(this->super_JavascriptLibraryBase).functionPrototype,(DynamicObject *)this_06);
  local_438 = (nullptr_t)0x0;
  Memory::WriteBarrierPtr<Js::DynamicObject>::operator=
            (&(this->super_JavascriptLibraryBase).promisePrototype,&local_438);
  local_440 = (nullptr_t)0x0;
  Memory::WriteBarrierPtr<Js::DynamicObject>::operator=
            (&(this->super_JavascriptLibraryBase).generatorFunctionPrototype,&local_440);
  local_448 = (nullptr_t)0x0;
  Memory::WriteBarrierPtr<Js::DynamicObject>::operator=
            (&(this->super_JavascriptLibraryBase).generatorPrototype,&local_448);
  local_450 = (nullptr_t)0x0;
  Memory::WriteBarrierPtr<Js::DynamicObject>::operator=
            (&(this->super_JavascriptLibraryBase).asyncFunctionPrototype,&local_450);
  local_458 = (nullptr_t)0x0;
  Memory::WriteBarrierPtr<Js::DynamicObject>::operator=
            (&(this->super_JavascriptLibraryBase).asyncGeneratorPrototype,&local_458);
  local_460 = (nullptr_t)0x0;
  Memory::WriteBarrierPtr<Js::DynamicObject>::operator=
            (&(this->super_JavascriptLibraryBase).asyncGeneratorFunctionPrototype,&local_460);
  pDVar9 = tempDynamicType;
  ppSVar2 = Memory::WriteBarrierPtr::operator_cast_to_ScriptContext__
                      ((WriteBarrierPtr *)&(this->super_JavascriptLibraryBase).scriptContext);
  pSVar11 = *ppSVar2;
  ppOVar8 = Memory::WriteBarrierPtr::operator_cast_to_ObjectPrototypeObject__
                      ((WriteBarrierPtr *)&(this->super_JavascriptLibraryBase).objectPrototype);
  pOVar7 = *ppOVar8;
  typeHandler_24 =
       DeferredTypeHandler<&Js::JavascriptLibrary::InitializeSymbolPrototype,_Js::DefaultDeferredTypeFilter,_true,_(unsigned_short)0,_(unsigned_short)0>
       ::GetDefaultInstance();
  pDVar6 = DynamicType::New(pSVar11,TypeIds_Object,(RecyclableObject *)pOVar7,(JavascriptMethod)0x0,
                            (DynamicTypeHandler *)typeHandler_24,false,false);
  pDVar10 = DynamicObject::New((Recycler *)pDVar9,pDVar6);
  Memory::WriteBarrierPtr<Js::DynamicObject>::operator=
            (&(this->super_JavascriptLibraryBase).symbolPrototype,pDVar10);
  pDVar9 = tempDynamicType;
  ppSVar2 = Memory::WriteBarrierPtr::operator_cast_to_ScriptContext__
                      ((WriteBarrierPtr *)&(this->super_JavascriptLibraryBase).scriptContext);
  pSVar11 = *ppSVar2;
  ppOVar8 = Memory::WriteBarrierPtr::operator_cast_to_ObjectPrototypeObject__
                      ((WriteBarrierPtr *)&(this->super_JavascriptLibraryBase).objectPrototype);
  pOVar7 = *ppOVar8;
  typeHandler_25 =
       DeferredTypeHandler<&Js::JavascriptLibrary::InitializeMapPrototype,_Js::DefaultDeferredTypeFilter,_true,_(unsigned_short)0,_(unsigned_short)0>
       ::GetDefaultInstance();
  pDVar6 = DynamicType::New(pSVar11,TypeIds_Object,(RecyclableObject *)pOVar7,(JavascriptMethod)0x0,
                            (DynamicTypeHandler *)typeHandler_25,false,false);
  pDVar10 = DynamicObject::New((Recycler *)pDVar9,pDVar6);
  Memory::WriteBarrierPtr<Js::DynamicObject>::operator=
            (&(this->super_JavascriptLibraryBase).mapPrototype,pDVar10);
  pDVar9 = tempDynamicType;
  ppSVar2 = Memory::WriteBarrierPtr::operator_cast_to_ScriptContext__
                      ((WriteBarrierPtr *)&(this->super_JavascriptLibraryBase).scriptContext);
  pSVar11 = *ppSVar2;
  ppOVar8 = Memory::WriteBarrierPtr::operator_cast_to_ObjectPrototypeObject__
                      ((WriteBarrierPtr *)&(this->super_JavascriptLibraryBase).objectPrototype);
  pOVar7 = *ppOVar8;
  typeHandler_26 =
       DeferredTypeHandler<&Js::JavascriptLibrary::InitializeSetPrototype,_Js::DefaultDeferredTypeFilter,_true,_(unsigned_short)0,_(unsigned_short)0>
       ::GetDefaultInstance();
  pDVar6 = DynamicType::New(pSVar11,TypeIds_Object,(RecyclableObject *)pOVar7,(JavascriptMethod)0x0,
                            (DynamicTypeHandler *)typeHandler_26,false,false);
  pDVar10 = DynamicObject::New((Recycler *)pDVar9,pDVar6);
  Memory::WriteBarrierPtr<Js::DynamicObject>::operator=
            (&(this->super_JavascriptLibraryBase).setPrototype,pDVar10);
  pDVar9 = tempDynamicType;
  ppSVar2 = Memory::WriteBarrierPtr::operator_cast_to_ScriptContext__
                      ((WriteBarrierPtr *)&(this->super_JavascriptLibraryBase).scriptContext);
  pSVar11 = *ppSVar2;
  ppOVar8 = Memory::WriteBarrierPtr::operator_cast_to_ObjectPrototypeObject__
                      ((WriteBarrierPtr *)&(this->super_JavascriptLibraryBase).objectPrototype);
  pOVar7 = *ppOVar8;
  typeHandler_27 =
       DeferredTypeHandler<&Js::JavascriptLibrary::InitializeWeakMapPrototype,_Js::DefaultDeferredTypeFilter,_true,_(unsigned_short)0,_(unsigned_short)0>
       ::GetDefaultInstance();
  pDVar6 = DynamicType::New(pSVar11,TypeIds_Object,(RecyclableObject *)pOVar7,(JavascriptMethod)0x0,
                            (DynamicTypeHandler *)typeHandler_27,false,false);
  pDVar10 = DynamicObject::New((Recycler *)pDVar9,pDVar6);
  Memory::WriteBarrierPtr<Js::DynamicObject>::operator=
            (&(this->super_JavascriptLibraryBase).weakMapPrototype,pDVar10);
  pDVar9 = tempDynamicType;
  ppSVar2 = Memory::WriteBarrierPtr::operator_cast_to_ScriptContext__
                      ((WriteBarrierPtr *)&(this->super_JavascriptLibraryBase).scriptContext);
  pSVar11 = *ppSVar2;
  ppOVar8 = Memory::WriteBarrierPtr::operator_cast_to_ObjectPrototypeObject__
                      ((WriteBarrierPtr *)&(this->super_JavascriptLibraryBase).objectPrototype);
  pOVar7 = *ppOVar8;
  typeHandler_28 =
       DeferredTypeHandler<&Js::JavascriptLibrary::InitializeWeakSetPrototype,_Js::DefaultDeferredTypeFilter,_true,_(unsigned_short)0,_(unsigned_short)0>
       ::GetDefaultInstance();
  pDVar6 = DynamicType::New(pSVar11,TypeIds_Object,(RecyclableObject *)pOVar7,(JavascriptMethod)0x0,
                            (DynamicTypeHandler *)typeHandler_28,false,false);
  pDVar10 = DynamicObject::New((Recycler *)pDVar9,pDVar6);
  Memory::WriteBarrierPtr<Js::DynamicObject>::operator=
            (&(this->super_JavascriptLibraryBase).weakSetPrototype,pDVar10);
  pSVar11 = Memory::WriteBarrierPtr<Js::ScriptContext>::operator->
                      (&(this->super_JavascriptLibraryBase).scriptContext);
  pSVar12 = ScriptContext::GetConfig(pSVar11);
  bVar1 = ScriptConfiguration::IsES2018AsyncIterationEnabled(pSVar12);
  pDVar9 = tempDynamicType;
  if (bVar1) {
    ppSVar2 = Memory::WriteBarrierPtr::operator_cast_to_ScriptContext__
                        ((WriteBarrierPtr *)&(this->super_JavascriptLibraryBase).scriptContext);
    pSVar11 = *ppSVar2;
    ppOVar8 = Memory::WriteBarrierPtr::operator_cast_to_ObjectPrototypeObject__
                        ((WriteBarrierPtr *)&(this->super_JavascriptLibraryBase).objectPrototype);
    pOVar7 = *ppOVar8;
    typeHandler_29 =
         DeferredTypeHandler<&Js::JavascriptLibrary::InitializeAsyncIteratorPrototype,_Js::DefaultDeferredTypeFilter,_true,_(unsigned_short)0,_(unsigned_short)0>
         ::GetDefaultInstance();
    pDVar6 = DynamicType::New(pSVar11,TypeIds_Object,(RecyclableObject *)pOVar7,
                              (JavascriptMethod)0x0,(DynamicTypeHandler *)typeHandler_29,false,false
                             );
    pDVar10 = DynamicObject::New((Recycler *)pDVar9,pDVar6);
    Memory::WriteBarrierPtr<Js::DynamicObject>::operator=
              (&(this->super_JavascriptLibraryBase).asyncIteratorPrototype,pDVar10);
  }
  pDVar9 = tempDynamicType;
  ppSVar2 = Memory::WriteBarrierPtr::operator_cast_to_ScriptContext__
                      ((WriteBarrierPtr *)&(this->super_JavascriptLibraryBase).scriptContext);
  pSVar11 = *ppSVar2;
  ppOVar8 = Memory::WriteBarrierPtr::operator_cast_to_ObjectPrototypeObject__
                      ((WriteBarrierPtr *)&(this->super_JavascriptLibraryBase).objectPrototype);
  pOVar7 = *ppOVar8;
  typeHandler_30 =
       DeferredTypeHandler<&Js::JavascriptLibrary::InitializeIteratorPrototype,_Js::DefaultDeferredTypeFilter,_true,_(unsigned_short)0,_(unsigned_short)0>
       ::GetDefaultInstance();
  pDVar6 = DynamicType::New(pSVar11,TypeIds_Object,(RecyclableObject *)pOVar7,(JavascriptMethod)0x0,
                            (DynamicTypeHandler *)typeHandler_30,false,false);
  pDVar10 = DynamicObject::New((Recycler *)pDVar9,pDVar6);
  Memory::WriteBarrierPtr<Js::DynamicObject>::operator=
            (&(this->super_JavascriptLibraryBase).iteratorPrototype,pDVar10);
  pSVar11 = Memory::WriteBarrierPtr<Js::ScriptContext>::operator->
                      (&(this->super_JavascriptLibraryBase).scriptContext);
  bVar1 = ScriptContext::IsJsBuiltInEnabled(pSVar11);
  pDVar9 = tempDynamicType;
  if (!bVar1) {
    ppSVar2 = Memory::WriteBarrierPtr::operator_cast_to_ScriptContext__
                        ((WriteBarrierPtr *)&(this->super_JavascriptLibraryBase).scriptContext);
    pSVar11 = *ppSVar2;
    ppDVar13 = Memory::WriteBarrierPtr::operator_cast_to_DynamicObject__
                         ((WriteBarrierPtr *)&(this->super_JavascriptLibraryBase).iteratorPrototype)
    ;
    pDVar10 = *ppDVar13;
    typeHandler_31 =
         DeferredTypeHandler<&Js::JavascriptLibrary::InitializeArrayIteratorPrototype,_Js::DefaultDeferredTypeFilter,_true,_(unsigned_short)0,_(unsigned_short)0>
         ::GetDefaultInstance();
    pDVar6 = DynamicType::New(pSVar11,TypeIds_Object,&pDVar10->super_RecyclableObject,
                              (JavascriptMethod)0x0,(DynamicTypeHandler *)typeHandler_31,false,false
                             );
    pDVar10 = DynamicObject::New((Recycler *)pDVar9,pDVar6);
    Memory::WriteBarrierPtr<Js::DynamicObject>::operator=
              (&(this->super_JavascriptLibraryBase).arrayIteratorPrototype,pDVar10);
  }
  pDVar9 = tempDynamicType;
  ppSVar2 = Memory::WriteBarrierPtr::operator_cast_to_ScriptContext__
                      ((WriteBarrierPtr *)&(this->super_JavascriptLibraryBase).scriptContext);
  pSVar11 = *ppSVar2;
  ppDVar13 = Memory::WriteBarrierPtr::operator_cast_to_DynamicObject__
                       ((WriteBarrierPtr *)&(this->super_JavascriptLibraryBase).iteratorPrototype);
  pDVar10 = *ppDVar13;
  typeHandler_32 =
       DeferredTypeHandler<&Js::JavascriptLibrary::InitializeMapIteratorPrototype,_Js::DefaultDeferredTypeFilter,_true,_(unsigned_short)0,_(unsigned_short)0>
       ::GetDefaultInstance();
  pDVar6 = DynamicType::New(pSVar11,TypeIds_Object,&pDVar10->super_RecyclableObject,
                            (JavascriptMethod)0x0,(DynamicTypeHandler *)typeHandler_32,false,false);
  pDVar10 = DynamicObject::New((Recycler *)pDVar9,pDVar6);
  Memory::WriteBarrierPtr<Js::DynamicObject>::operator=
            (&(this->super_JavascriptLibraryBase).mapIteratorPrototype,pDVar10);
  pDVar9 = tempDynamicType;
  ppSVar2 = Memory::WriteBarrierPtr::operator_cast_to_ScriptContext__
                      ((WriteBarrierPtr *)&(this->super_JavascriptLibraryBase).scriptContext);
  pSVar11 = *ppSVar2;
  ppDVar13 = Memory::WriteBarrierPtr::operator_cast_to_DynamicObject__
                       ((WriteBarrierPtr *)&(this->super_JavascriptLibraryBase).iteratorPrototype);
  pDVar10 = *ppDVar13;
  typeHandler_33 =
       DeferredTypeHandler<&Js::JavascriptLibrary::InitializeSetIteratorPrototype,_Js::DefaultDeferredTypeFilter,_true,_(unsigned_short)0,_(unsigned_short)0>
       ::GetDefaultInstance();
  pDVar6 = DynamicType::New(pSVar11,TypeIds_Object,&pDVar10->super_RecyclableObject,
                            (JavascriptMethod)0x0,(DynamicTypeHandler *)typeHandler_33,false,false);
  pDVar10 = DynamicObject::New((Recycler *)pDVar9,pDVar6);
  Memory::WriteBarrierPtr<Js::DynamicObject>::operator=
            (&(this->super_JavascriptLibraryBase).setIteratorPrototype,pDVar10);
  pDVar9 = tempDynamicType;
  ppSVar2 = Memory::WriteBarrierPtr::operator_cast_to_ScriptContext__
                      ((WriteBarrierPtr *)&(this->super_JavascriptLibraryBase).scriptContext);
  pSVar11 = *ppSVar2;
  ppDVar13 = Memory::WriteBarrierPtr::operator_cast_to_DynamicObject__
                       ((WriteBarrierPtr *)&(this->super_JavascriptLibraryBase).iteratorPrototype);
  pDVar10 = *ppDVar13;
  typeHandler_34 =
       DeferredTypeHandler<&Js::JavascriptLibrary::InitializeStringIteratorPrototype,_Js::DefaultDeferredTypeFilter,_true,_(unsigned_short)0,_(unsigned_short)0>
       ::GetDefaultInstance();
  pDVar6 = DynamicType::New(pSVar11,TypeIds_Object,&pDVar10->super_RecyclableObject,
                            (JavascriptMethod)0x0,(DynamicTypeHandler *)typeHandler_34,false,false);
  pDVar10 = DynamicObject::New((Recycler *)pDVar9,pDVar6);
  Memory::WriteBarrierPtr<Js::DynamicObject>::operator=
            (&(this->super_JavascriptLibraryBase).stringIteratorPrototype,pDVar10);
  if (((DAT_01e9e23b & 1) != 0) &&
     (bVar1 = PhaseIsEnabled::WasmPhase(), pDVar9 = tempDynamicType, bVar1)) {
    ppSVar2 = Memory::WriteBarrierPtr::operator_cast_to_ScriptContext__
                        ((WriteBarrierPtr *)&(this->super_JavascriptLibraryBase).scriptContext);
    pSVar11 = *ppSVar2;
    ppOVar8 = Memory::WriteBarrierPtr::operator_cast_to_ObjectPrototypeObject__
                        ((WriteBarrierPtr *)&(this->super_JavascriptLibraryBase).objectPrototype);
    pOVar7 = *ppOVar8;
    typeHandler_35 =
         DeferredTypeHandler<&Js::JavascriptLibrary::InitializeWebAssemblyMemoryPrototype,_Js::DefaultDeferredTypeFilter,_true,_(unsigned_short)0,_(unsigned_short)0>
         ::GetDefaultInstance();
    pDVar6 = DynamicType::New(pSVar11,TypeIds_Object,(RecyclableObject *)pOVar7,
                              (JavascriptMethod)0x0,(DynamicTypeHandler *)typeHandler_35,false,false
                             );
    pDVar10 = DynamicObject::New((Recycler *)pDVar9,pDVar6);
    Memory::WriteBarrierPtr<Js::DynamicObject>::operator=(&this->webAssemblyMemoryPrototype,pDVar10)
    ;
    pDVar9 = tempDynamicType;
    ppSVar2 = Memory::WriteBarrierPtr::operator_cast_to_ScriptContext__
                        ((WriteBarrierPtr *)&(this->super_JavascriptLibraryBase).scriptContext);
    pSVar11 = *ppSVar2;
    ppOVar8 = Memory::WriteBarrierPtr::operator_cast_to_ObjectPrototypeObject__
                        ((WriteBarrierPtr *)&(this->super_JavascriptLibraryBase).objectPrototype);
    pOVar7 = *ppOVar8;
    typeHandler_36 =
         DeferredTypeHandler<&Js::JavascriptLibrary::InitializeWebAssemblyModulePrototype,_Js::DefaultDeferredTypeFilter,_true,_(unsigned_short)0,_(unsigned_short)0>
         ::GetDefaultInstance();
    pDVar6 = DynamicType::New(pSVar11,TypeIds_Object,(RecyclableObject *)pOVar7,
                              (JavascriptMethod)0x0,(DynamicTypeHandler *)typeHandler_36,false,false
                             );
    pDVar10 = DynamicObject::New((Recycler *)pDVar9,pDVar6);
    Memory::WriteBarrierPtr<Js::DynamicObject>::operator=(&this->webAssemblyModulePrototype,pDVar10)
    ;
    pDVar9 = tempDynamicType;
    ppSVar2 = Memory::WriteBarrierPtr::operator_cast_to_ScriptContext__
                        ((WriteBarrierPtr *)&(this->super_JavascriptLibraryBase).scriptContext);
    pSVar11 = *ppSVar2;
    ppOVar8 = Memory::WriteBarrierPtr::operator_cast_to_ObjectPrototypeObject__
                        ((WriteBarrierPtr *)&(this->super_JavascriptLibraryBase).objectPrototype);
    pOVar7 = *ppOVar8;
    typeHandler_37 =
         DeferredTypeHandler<&Js::JavascriptLibrary::InitializeWebAssemblyInstancePrototype,_Js::DefaultDeferredTypeFilter,_true,_(unsigned_short)0,_(unsigned_short)0>
         ::GetDefaultInstance();
    pDVar6 = DynamicType::New(pSVar11,TypeIds_Object,(RecyclableObject *)pOVar7,
                              (JavascriptMethod)0x0,(DynamicTypeHandler *)typeHandler_37,false,false
                             );
    pDVar10 = DynamicObject::New((Recycler *)pDVar9,pDVar6);
    Memory::WriteBarrierPtr<Js::DynamicObject>::operator=
              (&this->webAssemblyInstancePrototype,pDVar10);
    pDVar9 = tempDynamicType;
    ppSVar2 = Memory::WriteBarrierPtr::operator_cast_to_ScriptContext__
                        ((WriteBarrierPtr *)&(this->super_JavascriptLibraryBase).scriptContext);
    pSVar11 = *ppSVar2;
    ppOVar8 = Memory::WriteBarrierPtr::operator_cast_to_ObjectPrototypeObject__
                        ((WriteBarrierPtr *)&(this->super_JavascriptLibraryBase).objectPrototype);
    pOVar7 = *ppOVar8;
    typeHandler_38 =
         DeferredTypeHandler<&Js::JavascriptLibrary::InitializeWebAssemblyTablePrototype,_Js::DefaultDeferredTypeFilter,_true,_(unsigned_short)0,_(unsigned_short)0>
         ::GetDefaultInstance();
    pDVar6 = DynamicType::New(pSVar11,TypeIds_Object,(RecyclableObject *)pOVar7,
                              (JavascriptMethod)0x0,(DynamicTypeHandler *)typeHandler_38,false,false
                             );
    pDVar10 = DynamicObject::New((Recycler *)pDVar9,pDVar6);
    Memory::WriteBarrierPtr<Js::DynamicObject>::operator=(&this->webAssemblyTablePrototype,pDVar10);
  }
  pDVar9 = tempDynamicType;
  ppSVar2 = Memory::WriteBarrierPtr::operator_cast_to_ScriptContext__
                      ((WriteBarrierPtr *)&(this->super_JavascriptLibraryBase).scriptContext);
  pSVar11 = *ppSVar2;
  ppOVar8 = Memory::WriteBarrierPtr::operator_cast_to_ObjectPrototypeObject__
                      ((WriteBarrierPtr *)&(this->super_JavascriptLibraryBase).objectPrototype);
  pOVar7 = *ppOVar8;
  typeHandler_39 =
       DeferredTypeHandler<&Js::JavascriptLibrary::InitializePromisePrototype,_Js::DefaultDeferredTypeFilter,_true,_(unsigned_short)0,_(unsigned_short)0>
       ::GetDefaultInstance();
  pDVar6 = DynamicType::New(pSVar11,TypeIds_Object,(RecyclableObject *)pOVar7,(JavascriptMethod)0x0,
                            (DynamicTypeHandler *)typeHandler_39,false,false);
  pDVar10 = DynamicObject::New((Recycler *)pDVar9,pDVar6);
  Memory::WriteBarrierPtr<Js::DynamicObject>::operator=
            (&(this->super_JavascriptLibraryBase).promisePrototype,pDVar10);
  pSVar11 = Memory::WriteBarrierPtr<Js::ScriptContext>::operator->
                      (&(this->super_JavascriptLibraryBase).scriptContext);
  pSVar12 = ScriptContext::GetConfig(pSVar11);
  bVar1 = ScriptConfiguration::IsES6GeneratorsEnabled(pSVar12);
  pDVar9 = tempDynamicType;
  if (bVar1) {
    ppSVar2 = Memory::WriteBarrierPtr::operator_cast_to_ScriptContext__
                        ((WriteBarrierPtr *)&(this->super_JavascriptLibraryBase).scriptContext);
    pSVar11 = *ppSVar2;
    ppDVar13 = Memory::WriteBarrierPtr::operator_cast_to_DynamicObject__
                         ((WriteBarrierPtr *)&(this->super_JavascriptLibraryBase).functionPrototype)
    ;
    pDVar10 = *ppDVar13;
    typeHandler_40 =
         DeferredTypeHandler<&Js::JavascriptLibrary::InitializeGeneratorFunctionPrototype,_Js::DefaultDeferredTypeFilter,_true,_(unsigned_short)0,_(unsigned_short)0>
         ::GetDefaultInstance();
    pDVar6 = DynamicType::New(pSVar11,TypeIds_Object,&pDVar10->super_RecyclableObject,
                              (JavascriptMethod)0x0,(DynamicTypeHandler *)typeHandler_40,false,false
                             );
    pDVar10 = DynamicObject::New((Recycler *)pDVar9,pDVar6);
    Memory::WriteBarrierPtr<Js::DynamicObject>::operator=
              (&(this->super_JavascriptLibraryBase).generatorFunctionPrototype,pDVar10);
    pDVar9 = tempDynamicType;
    ppSVar2 = Memory::WriteBarrierPtr::operator_cast_to_ScriptContext__
                        ((WriteBarrierPtr *)&(this->super_JavascriptLibraryBase).scriptContext);
    pSVar11 = *ppSVar2;
    ppDVar13 = Memory::WriteBarrierPtr::operator_cast_to_DynamicObject__
                         ((WriteBarrierPtr *)&(this->super_JavascriptLibraryBase).iteratorPrototype)
    ;
    pDVar10 = *ppDVar13;
    typeHandler_41 =
         DeferredTypeHandler<&Js::JavascriptLibrary::InitializeGeneratorPrototype,_Js::DefaultDeferredTypeFilter,_true,_(unsigned_short)0,_(unsigned_short)0>
         ::GetDefaultInstance();
    pDVar6 = DynamicType::New(pSVar11,TypeIds_Object,&pDVar10->super_RecyclableObject,
                              (JavascriptMethod)0x0,(DynamicTypeHandler *)typeHandler_41,false,false
                             );
    pDVar10 = DynamicObject::New((Recycler *)pDVar9,pDVar6);
    Memory::WriteBarrierPtr<Js::DynamicObject>::operator=
              (&(this->super_JavascriptLibraryBase).generatorPrototype,pDVar10);
  }
  pSVar11 = Memory::WriteBarrierPtr<Js::ScriptContext>::operator->
                      (&(this->super_JavascriptLibraryBase).scriptContext);
  pSVar12 = ScriptContext::GetConfig(pSVar11);
  bVar1 = ScriptConfiguration::IsES7AsyncAndAwaitEnabled(pSVar12);
  pDVar9 = tempDynamicType;
  if (bVar1) {
    ppSVar2 = Memory::WriteBarrierPtr::operator_cast_to_ScriptContext__
                        ((WriteBarrierPtr *)&(this->super_JavascriptLibraryBase).scriptContext);
    pSVar11 = *ppSVar2;
    ppDVar13 = Memory::WriteBarrierPtr::operator_cast_to_DynamicObject__
                         ((WriteBarrierPtr *)&(this->super_JavascriptLibraryBase).functionPrototype)
    ;
    pDVar10 = *ppDVar13;
    typeHandler_42 =
         DeferredTypeHandler<&Js::JavascriptLibrary::InitializeAsyncFunctionPrototype,_Js::DefaultDeferredTypeFilter,_true,_(unsigned_short)0,_(unsigned_short)0>
         ::GetDefaultInstance();
    pDVar6 = DynamicType::New(pSVar11,TypeIds_Object,&pDVar10->super_RecyclableObject,
                              (JavascriptMethod)0x0,(DynamicTypeHandler *)typeHandler_42,false,false
                             );
    pDVar10 = DynamicObject::New((Recycler *)pDVar9,pDVar6);
    Memory::WriteBarrierPtr<Js::DynamicObject>::operator=
              (&(this->super_JavascriptLibraryBase).asyncFunctionPrototype,pDVar10);
  }
  pSVar11 = Memory::WriteBarrierPtr<Js::ScriptContext>::operator->
                      (&(this->super_JavascriptLibraryBase).scriptContext);
  pSVar12 = ScriptContext::GetConfig(pSVar11);
  bVar1 = ScriptConfiguration::IsES2018AsyncIterationEnabled(pSVar12);
  pDVar9 = tempDynamicType;
  if (bVar1) {
    ppSVar2 = Memory::WriteBarrierPtr::operator_cast_to_ScriptContext__
                        ((WriteBarrierPtr *)&(this->super_JavascriptLibraryBase).scriptContext);
    pSVar11 = *ppSVar2;
    ppDVar13 = Memory::WriteBarrierPtr::operator_cast_to_DynamicObject__
                         ((WriteBarrierPtr *)&(this->super_JavascriptLibraryBase).functionPrototype)
    ;
    pDVar10 = *ppDVar13;
    typeHandler_43 =
         DeferredTypeHandler<&Js::JavascriptLibrary::InitializeAsyncGeneratorFunctionPrototype,_Js::DefaultDeferredTypeFilter,_true,_(unsigned_short)0,_(unsigned_short)0>
         ::GetDefaultInstance();
    pDVar6 = DynamicType::New(pSVar11,TypeIds_Object,&pDVar10->super_RecyclableObject,
                              (JavascriptMethod)0x0,(DynamicTypeHandler *)typeHandler_43,false,false
                             );
    pDVar10 = DynamicObject::New((Recycler *)pDVar9,pDVar6);
    Memory::WriteBarrierPtr<Js::DynamicObject>::operator=
              (&(this->super_JavascriptLibraryBase).asyncGeneratorFunctionPrototype,pDVar10);
    pDVar9 = tempDynamicType;
    ppSVar2 = Memory::WriteBarrierPtr::operator_cast_to_ScriptContext__
                        ((WriteBarrierPtr *)&(this->super_JavascriptLibraryBase).scriptContext);
    pSVar11 = *ppSVar2;
    ppDVar13 = Memory::WriteBarrierPtr::operator_cast_to_DynamicObject__
                         ((WriteBarrierPtr *)
                          &(this->super_JavascriptLibraryBase).asyncIteratorPrototype);
    pDVar10 = *ppDVar13;
    typeHandler_44 =
         DeferredTypeHandler<&Js::JavascriptLibrary::InitializeAsyncGeneratorPrototype,_Js::DefaultDeferredTypeFilter,_true,_(unsigned_short)0,_(unsigned_short)0>
         ::GetDefaultInstance();
    pDVar6 = DynamicType::New(pSVar11,TypeIds_Object,&pDVar10->super_RecyclableObject,
                              (JavascriptMethod)0x0,(DynamicTypeHandler *)typeHandler_44,false,false
                             );
    pDVar10 = DynamicObject::New((Recycler *)pDVar9,pDVar6);
    Memory::WriteBarrierPtr<Js::DynamicObject>::operator=
              (&(this->super_JavascriptLibraryBase).asyncGeneratorPrototype,pDVar10);
    pDVar9 = tempDynamicType;
    ppSVar2 = Memory::WriteBarrierPtr::operator_cast_to_ScriptContext__
                        ((WriteBarrierPtr *)&(this->super_JavascriptLibraryBase).scriptContext);
    pSVar11 = *ppSVar2;
    ppDVar13 = Memory::WriteBarrierPtr::operator_cast_to_DynamicObject__
                         ((WriteBarrierPtr *)
                          &(this->super_JavascriptLibraryBase).asyncIteratorPrototype);
    pDVar10 = *ppDVar13;
    typeHandler_45 =
         DeferredTypeHandler<&Js::JavascriptLibrary::InitializeAsyncFromSyncIteratorPrototype,_Js::DefaultDeferredTypeFilter,_true,_(unsigned_short)0,_(unsigned_short)0>
         ::GetDefaultInstance();
    pDVar6 = DynamicType::New(pSVar11,TypeIds_Object,&pDVar10->super_RecyclableObject,
                              (JavascriptMethod)0x0,(DynamicTypeHandler *)typeHandler_45,false,false
                             );
    pDVar10 = DynamicObject::New((Recycler *)pDVar9,pDVar6);
    Memory::WriteBarrierPtr<Js::DynamicObject>::operator=
              (&(this->super_JavascriptLibraryBase).asyncFromSyncIteratorProtototype,pDVar10);
  }
  return;
}

Assistant:

void JavascriptLibrary::InitializePrototypes()
    {
        Recycler* recycler = this->GetRecycler();

        // Recycler macros below expect that their arguments will not throw when they're evaluated.
        // We allocate a lot of types for the built-in prototype objects which we need to store temporarily.
        DynamicType* tempDynamicType = nullptr;
        Type* tempType = StaticType::New(scriptContext, TypeIds_Null, nullptr, nullptr);
        nullValue = RecyclerNew(recycler, RecyclableObject, tempType);
        nullValue->GetType()->SetHasSpecialPrototype(true);
        this->rootPath = TypePath::New(recycler);

        // The prototype property of the object prototype is null.
        objectPrototype = ObjectPrototypeObject::New(recycler,
            DynamicType::New(scriptContext, TypeIds_Object, nullValue, nullptr,
            DeferredTypeHandler<InitializeObjectPrototype, DefaultDeferredTypeFilter, true>::GetDefaultInstance()));

        constructorPrototypeObjectType = DynamicType::New(scriptContext, TypeIds_Object, objectPrototype, nullptr,
            &SharedPrototypeTypeHandler, true, true);

        constructorPrototypeObjectType->SetHasNoEnumerableProperties(true);

        arrayBufferPrototype = DynamicObject::New(recycler,
            DynamicType::New(scriptContext, TypeIds_Object, objectPrototype, nullptr,
                DeferredTypeHandler<InitializeArrayBufferPrototype, DefaultDeferredTypeFilter, true>::GetDefaultInstance()));

        if (scriptContext->GetConfig()->IsESSharedArrayBufferEnabled())
        {
            sharedArrayBufferPrototype = DynamicObject::New(recycler,
                DynamicType::New(scriptContext, TypeIds_Object, objectPrototype, nullptr,
                    DeferredTypeHandler<InitializeSharedArrayBufferPrototype, DefaultDeferredTypeFilter, true>::GetDefaultInstance()));
        }
        else
        {
            sharedArrayBufferPrototype = nullptr;
        }

        dataViewPrototype = DynamicObject::New(recycler,
            DynamicType::New(scriptContext, TypeIds_Object, objectPrototype, nullptr,
                DeferredTypeHandler<InitializeDataViewPrototype, DefaultDeferredTypeFilter, true>::GetDefaultInstance()));

        typedArrayPrototype = DynamicObject::New(recycler,
            DynamicType::New(scriptContext, TypeIds_Object, objectPrototype, nullptr,
                DeferredTypeHandler<InitializeTypedArrayPrototype, DefaultDeferredTypeFilter, true>::GetDefaultInstance()));

        Int8ArrayPrototype = DynamicObject::New(recycler,
            DynamicType::New(scriptContext, TypeIds_Object, typedArrayPrototype, nullptr,
                DeferredTypeHandler<InitializeInt8ArrayPrototype, DefaultDeferredTypeFilter, true>::GetDefaultInstance()));

        Uint8ArrayPrototype = DynamicObject::New(recycler,
            DynamicType::New(scriptContext, TypeIds_Object, typedArrayPrototype, nullptr,
                DeferredTypeHandler<InitializeUint8ArrayPrototype, DefaultDeferredTypeFilter, true>::GetDefaultInstance()));

        // If ES6 TypedArrays are enabled, we have Khronos Interop mode enabled
        Uint8ClampedArrayPrototype = DynamicObject::New(recycler,
            DynamicType::New(scriptContext, TypeIds_Object, typedArrayPrototype, nullptr,
                DeferredTypeHandler<InitializeUint8ClampedArrayPrototype, DefaultDeferredTypeFilter, true>::GetDefaultInstance()));

        Int16ArrayPrototype = DynamicObject::New(recycler,
            DynamicType::New(scriptContext, TypeIds_Object, typedArrayPrototype, nullptr,
                DeferredTypeHandler<InitializeInt16ArrayPrototype, DefaultDeferredTypeFilter, true>::GetDefaultInstance()));

        Uint16ArrayPrototype = DynamicObject::New(recycler,
            DynamicType::New(scriptContext, TypeIds_Object, typedArrayPrototype, nullptr,
                DeferredTypeHandler<InitializeUint16ArrayPrototype, DefaultDeferredTypeFilter, true>::GetDefaultInstance()));

        Int32ArrayPrototype = DynamicObject::New(recycler,
            DynamicType::New(scriptContext, TypeIds_Object, typedArrayPrototype, nullptr,
                DeferredTypeHandler<InitializeInt32ArrayPrototype, DefaultDeferredTypeFilter, true>::GetDefaultInstance()));

        Uint32ArrayPrototype = DynamicObject::New(recycler,
            DynamicType::New(scriptContext, TypeIds_Object, typedArrayPrototype, nullptr,
                DeferredTypeHandler<InitializeUint32ArrayPrototype, DefaultDeferredTypeFilter, true>::GetDefaultInstance()));

        Float32ArrayPrototype = DynamicObject::New(recycler,
            DynamicType::New(scriptContext, TypeIds_Object, typedArrayPrototype, nullptr,
                DeferredTypeHandler<InitializeFloat32ArrayPrototype, DefaultDeferredTypeFilter, true>::GetDefaultInstance()));

        Float64ArrayPrototype = DynamicObject::New(recycler,
            DynamicType::New(scriptContext, TypeIds_Object, typedArrayPrototype, nullptr,
                DeferredTypeHandler<InitializeFloat64ArrayPrototype, DefaultDeferredTypeFilter, true>::GetDefaultInstance()));

        Int64ArrayPrototype = DynamicObject::New(recycler,
            DynamicType::New(scriptContext, TypeIds_Object, typedArrayPrototype, nullptr,
                DeferredTypeHandler<InitializeInt64ArrayPrototype, DefaultDeferredTypeFilter, true>::GetDefaultInstance()));

        Uint64ArrayPrototype = DynamicObject::New(recycler,
            DynamicType::New(scriptContext, TypeIds_Object, typedArrayPrototype, nullptr,
                DeferredTypeHandler<InitializeUint64ArrayPrototype, DefaultDeferredTypeFilter, true>::GetDefaultInstance()));

        BoolArrayPrototype = DynamicObject::New(recycler,
            DynamicType::New(scriptContext, TypeIds_Object, typedArrayPrototype, nullptr,
                DeferredTypeHandler<InitializeBoolArrayPrototype, DefaultDeferredTypeFilter, true>::GetDefaultInstance()));

        CharArrayPrototype = DynamicObject::New(recycler,
            DynamicType::New(scriptContext, TypeIds_Object, typedArrayPrototype, nullptr,
                DeferredTypeHandler<InitializeCharArrayPrototype, DefaultDeferredTypeFilter, true>::GetDefaultInstance()));

        arrayPrototype = JavascriptArray::New<Var, JavascriptArray, 0>(0,
            DynamicType::New(scriptContext, TypeIds_Array, objectPrototype, nullptr,
            DeferredTypeHandler<InitializeArrayPrototype, DefaultDeferredTypeFilter, true>::GetDefaultInstance()), recycler);

        tempDynamicType = DynamicType::New(scriptContext, TypeIds_BooleanObject, objectPrototype, nullptr,
            DeferredTypeHandler<InitializeBooleanPrototype, DefaultDeferredTypeFilter, true>::GetDefaultInstance());
        booleanPrototype = RecyclerNew(recycler, JavascriptBooleanObject, nullptr, tempDynamicType);

        tempDynamicType = DynamicType::New(scriptContext, TypeIds_NumberObject, objectPrototype, nullptr,
            DeferredTypeHandler<InitializeNumberPrototype, DefaultDeferredTypeFilter, true>::GetDefaultInstance());
        numberPrototype = RecyclerNew(recycler, JavascriptNumberObject, TaggedInt::ToVarUnchecked(0), tempDynamicType);

        bigintPrototype = nullptr;
        if (scriptContext->GetConfig()->IsESBigIntEnabled())
        {
            tempDynamicType = DynamicType::New(scriptContext, TypeIds_BigIntObject, objectPrototype, nullptr,
                DeferredTypeHandler<InitializeBigIntPrototype, DefaultDeferredTypeFilter, true>::GetDefaultInstance());
            bigintPrototype = RecyclerNew(recycler, JavascriptBigIntObject, nullptr, tempDynamicType);
        }

        tempDynamicType = DynamicType::New(scriptContext, TypeIds_StringObject, objectPrototype, nullptr,
            DeferredTypeHandler<InitializeStringPrototype, DefaultDeferredTypeFilter, true>::GetDefaultInstance());
        stringPrototype = RecyclerNew(recycler, JavascriptStringObject, nullptr, tempDynamicType);

        if (scriptContext->GetConfig()->IsES6PrototypeChain())
        {
            datePrototype = DynamicObject::New(recycler,
                DynamicType::New(scriptContext, TypeIds_Object, objectPrototype, nullptr,
                DeferredTypeHandler<InitializeDatePrototype, DefaultDeferredTypeFilter, true>::GetDefaultInstance()));

            regexPrototype = DynamicObject::New(recycler,
                DynamicType::New(scriptContext, TypeIds_Object, objectPrototype, nullptr,
                DeferredTypeHandler<InitializeRegexPrototype, DefaultDeferredTypeFilter, true>::GetDefaultInstance()));

            errorPrototype = DynamicObject::New(recycler,
                DynamicType::New(scriptContext, TypeIds_Object, objectPrototype, nullptr,
                    DeferredTypeHandler<InitializeErrorPrototype, DefaultDeferredTypeFilter, true>::GetDefaultInstance()));
        }
        else
        {
            double initDateValue = JavascriptNumber::NaN;

            tempDynamicType = DynamicType::New(scriptContext, TypeIds_Date, objectPrototype, nullptr,
                DeferredTypeHandler<InitializeDatePrototype, DefaultDeferredTypeFilter, true>::GetDefaultInstance());
            datePrototype = RecyclerNewZ(recycler, JavascriptDate, initDateValue, tempDynamicType);

            tempDynamicType = DynamicType::New(scriptContext, TypeIds_Error, objectPrototype, nullptr,
                DeferredTypeHandler<InitializeErrorPrototype, DefaultDeferredTypeFilter, true>::GetDefaultInstance());
            errorPrototype = RecyclerNew(this->GetRecycler(), JavascriptError, tempDynamicType, /*isExternalError*/FALSE, /*isPrototype*/TRUE);
        }

#define INIT_ERROR_PROTO(field, initFunc) \
        if (scriptContext->GetConfig()->IsES6PrototypeChain()) \
        { \
            field = DynamicObject::New(recycler, \
                DynamicType::New(scriptContext, TypeIds_Object, errorPrototype, nullptr, \
                DeferredTypeHandler<initFunc, DefaultDeferredTypeFilter, true>::GetDefaultInstance())); \
        } \
        else \
        { \
            tempDynamicType = DynamicType::New(scriptContext, TypeIds_Error, errorPrototype, nullptr, \
                DeferredTypeHandler<initFunc, DefaultDeferredTypeFilter, true>::GetDefaultInstance()); \
            field = RecyclerNew(this->GetRecycler(), JavascriptError, tempDynamicType, /*isExternalError*/FALSE, /*isPrototype*/TRUE); \
        }